

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  void *pvVar13;
  __int_type_conflict _Var14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  uint uVar65;
  byte bVar66;
  ulong uVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar70;
  long lVar71;
  ulong uVar72;
  uint uVar73;
  bool bVar74;
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar76 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar104 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float t1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar168;
  float fVar188;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar186;
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar192;
  float fVar212;
  float fVar213;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar208 [32];
  float fVar214;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar218;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar235;
  float fVar236;
  float fVar238;
  float fVar240;
  float fVar241;
  undefined1 auVar231 [32];
  float fVar237;
  undefined1 auVar232 [32];
  undefined1 auVar239 [16];
  undefined1 auVar234 [64];
  vfloat4 b0;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar280;
  float fVar281;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar282;
  undefined1 auVar279 [32];
  __m128 a;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  float fVar303;
  float fVar304;
  vfloat4 a0_1;
  float fVar305;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar306;
  float fVar312;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar310;
  float fVar311;
  float fVar313;
  float fVar314;
  float fVar315;
  float in_register_0000151c;
  undefined1 auVar309 [32];
  float fVar316;
  float fVar317;
  float fVar325;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  float fVar323;
  float fVar324;
  undefined1 auVar321 [32];
  float fVar326;
  undefined1 auVar322 [64];
  float fVar327;
  float fVar335;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar333;
  float fVar334;
  float in_register_0000159c;
  undefined1 auVar331 [32];
  float fVar337;
  vfloat4 a0;
  undefined1 auVar336 [16];
  float in_register_000015dc;
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [8];
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  uint auStack_4b0 [4];
  RTCFilterFunctionNArguments local_4a0;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  float afStack_340 [8];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar233 [32];
  undefined1 auVar332 [32];
  
  PVar10 = prim[1];
  uVar68 = (ulong)(byte)PVar10;
  lVar71 = uVar68 * 5;
  auVar150 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar150 = vinsertps_avx(auVar150,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar223 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar223 = vinsertps_avx(auVar223,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar192 = *(float *)(prim + uVar68 * 0x19 + 0x12);
  auVar150 = vsubps_avx(auVar150,*(undefined1 (*) [16])(prim + uVar68 * 0x19 + 6));
  auVar101._0_4_ = fVar192 * auVar150._0_4_;
  auVar101._4_4_ = fVar192 * auVar150._4_4_;
  auVar101._8_4_ = fVar192 * auVar150._8_4_;
  auVar101._12_4_ = fVar192 * auVar150._12_4_;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 10)));
  auVar193._0_4_ = fVar192 * auVar223._0_4_;
  auVar193._4_4_ = fVar192 * auVar223._4_4_;
  auVar193._8_4_ = fVar192 * auVar223._8_4_;
  auVar193._12_4_ = fVar192 * auVar223._12_4_;
  auVar90._16_16_ = auVar148;
  auVar90._0_16_ = auVar150;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar71 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar71 + 10)));
  auVar151._16_16_ = auVar223;
  auVar151._0_16_ = auVar150;
  auVar17 = vcvtdq2ps_avx(auVar151);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 10)));
  auVar163._16_16_ = auVar223;
  auVar163._0_16_ = auVar150;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xb + 6)));
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xb + 10)));
  auVar18 = vcvtdq2ps_avx(auVar163);
  auVar164._16_16_ = auVar223;
  auVar164._0_16_ = auVar150;
  auVar19 = vcvtdq2ps_avx(auVar164);
  uVar72 = (ulong)((uint)(byte)PVar10 * 0xc);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 10)));
  auVar231._16_16_ = auVar223;
  auVar231._0_16_ = auVar150;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar68 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar231);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar68 + 10)));
  auVar249._16_16_ = auVar223;
  auVar249._0_16_ = auVar150;
  lVar15 = uVar68 * 9;
  uVar72 = (ulong)(uint)((int)lVar15 * 2);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar249);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 10)));
  auVar250._16_16_ = auVar223;
  auVar250._0_16_ = auVar150;
  auVar22 = vcvtdq2ps_avx(auVar250);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar68 + 6)));
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar68 + 10)));
  auVar277._16_16_ = auVar223;
  auVar277._0_16_ = auVar150;
  uVar72 = (ulong)(uint)((int)lVar71 << 2);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 10)));
  auVar23 = vcvtdq2ps_avx(auVar277);
  auVar290._16_16_ = auVar223;
  auVar290._0_16_ = auVar150;
  auVar24 = vcvtdq2ps_avx(auVar290);
  auVar150 = vshufps_avx(auVar193,auVar193,0);
  auVar223 = vshufps_avx(auVar193,auVar193,0x55);
  auVar148 = vshufps_avx(auVar193,auVar193,0xaa);
  fVar192 = auVar148._0_4_;
  fVar218 = auVar148._4_4_;
  fVar212 = auVar148._8_4_;
  fVar235 = auVar148._12_4_;
  fVar213 = auVar223._0_4_;
  fVar236 = auVar223._4_4_;
  fVar214 = auVar223._8_4_;
  fVar237 = auVar223._12_4_;
  fVar215 = auVar150._0_4_;
  fVar238 = auVar150._4_4_;
  fVar216 = auVar150._8_4_;
  fVar240 = auVar150._12_4_;
  auVar309._0_4_ = fVar215 * auVar90._0_4_ + fVar213 * auVar17._0_4_ + fVar192 * auVar18._0_4_;
  auVar309._4_4_ = fVar238 * auVar90._4_4_ + fVar236 * auVar17._4_4_ + fVar218 * auVar18._4_4_;
  auVar309._8_4_ = fVar216 * auVar90._8_4_ + fVar214 * auVar17._8_4_ + fVar212 * auVar18._8_4_;
  auVar309._12_4_ = fVar240 * auVar90._12_4_ + fVar237 * auVar17._12_4_ + fVar235 * auVar18._12_4_;
  auVar309._16_4_ = fVar215 * auVar90._16_4_ + fVar213 * auVar17._16_4_ + fVar192 * auVar18._16_4_;
  auVar309._20_4_ = fVar238 * auVar90._20_4_ + fVar236 * auVar17._20_4_ + fVar218 * auVar18._20_4_;
  auVar309._24_4_ = fVar216 * auVar90._24_4_ + fVar214 * auVar17._24_4_ + fVar212 * auVar18._24_4_;
  auVar309._28_4_ = fVar237 + in_register_000015dc + in_register_0000151c;
  auVar300._0_4_ = fVar215 * auVar19._0_4_ + fVar213 * auVar20._0_4_ + auVar21._0_4_ * fVar192;
  auVar300._4_4_ = fVar238 * auVar19._4_4_ + fVar236 * auVar20._4_4_ + auVar21._4_4_ * fVar218;
  auVar300._8_4_ = fVar216 * auVar19._8_4_ + fVar214 * auVar20._8_4_ + auVar21._8_4_ * fVar212;
  auVar300._12_4_ = fVar240 * auVar19._12_4_ + fVar237 * auVar20._12_4_ + auVar21._12_4_ * fVar235;
  auVar300._16_4_ = fVar215 * auVar19._16_4_ + fVar213 * auVar20._16_4_ + auVar21._16_4_ * fVar192;
  auVar300._20_4_ = fVar238 * auVar19._20_4_ + fVar236 * auVar20._20_4_ + auVar21._20_4_ * fVar218;
  auVar300._24_4_ = fVar216 * auVar19._24_4_ + fVar214 * auVar20._24_4_ + auVar21._24_4_ * fVar212;
  auVar300._28_4_ = fVar237 + in_register_000015dc + in_register_0000159c;
  auVar208._0_4_ = fVar215 * auVar22._0_4_ + fVar213 * auVar23._0_4_ + auVar24._0_4_ * fVar192;
  auVar208._4_4_ = fVar238 * auVar22._4_4_ + fVar236 * auVar23._4_4_ + auVar24._4_4_ * fVar218;
  auVar208._8_4_ = fVar216 * auVar22._8_4_ + fVar214 * auVar23._8_4_ + auVar24._8_4_ * fVar212;
  auVar208._12_4_ = fVar240 * auVar22._12_4_ + fVar237 * auVar23._12_4_ + auVar24._12_4_ * fVar235;
  auVar208._16_4_ = fVar215 * auVar22._16_4_ + fVar213 * auVar23._16_4_ + auVar24._16_4_ * fVar192;
  auVar208._20_4_ = fVar238 * auVar22._20_4_ + fVar236 * auVar23._20_4_ + auVar24._20_4_ * fVar218;
  auVar208._24_4_ = fVar216 * auVar22._24_4_ + fVar214 * auVar23._24_4_ + auVar24._24_4_ * fVar212;
  auVar208._28_4_ = fVar240 + fVar237 + fVar235;
  auVar150 = vshufps_avx(auVar101,auVar101,0);
  auVar223 = vshufps_avx(auVar101,auVar101,0x55);
  auVar148 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar218 = auVar148._0_4_;
  fVar212 = auVar148._4_4_;
  fVar235 = auVar148._8_4_;
  fVar213 = auVar148._12_4_;
  fVar238 = auVar223._0_4_;
  fVar216 = auVar223._4_4_;
  fVar240 = auVar223._8_4_;
  fVar217 = auVar223._12_4_;
  fVar236 = auVar150._0_4_;
  fVar214 = auVar150._4_4_;
  fVar237 = auVar150._8_4_;
  fVar215 = auVar150._12_4_;
  fVar192 = auVar90._28_4_;
  auVar122._0_4_ = fVar236 * auVar90._0_4_ + fVar238 * auVar17._0_4_ + fVar218 * auVar18._0_4_;
  auVar122._4_4_ = fVar214 * auVar90._4_4_ + fVar216 * auVar17._4_4_ + fVar212 * auVar18._4_4_;
  auVar122._8_4_ = fVar237 * auVar90._8_4_ + fVar240 * auVar17._8_4_ + fVar235 * auVar18._8_4_;
  auVar122._12_4_ = fVar215 * auVar90._12_4_ + fVar217 * auVar17._12_4_ + fVar213 * auVar18._12_4_;
  auVar122._16_4_ = fVar236 * auVar90._16_4_ + fVar238 * auVar17._16_4_ + fVar218 * auVar18._16_4_;
  auVar122._20_4_ = fVar214 * auVar90._20_4_ + fVar216 * auVar17._20_4_ + fVar212 * auVar18._20_4_;
  auVar122._24_4_ = fVar237 * auVar90._24_4_ + fVar240 * auVar17._24_4_ + fVar235 * auVar18._24_4_;
  auVar122._28_4_ = fVar192 + auVar17._28_4_ + auVar18._28_4_;
  auVar152._0_4_ = fVar236 * auVar19._0_4_ + auVar21._0_4_ * fVar218 + fVar238 * auVar20._0_4_;
  auVar152._4_4_ = fVar214 * auVar19._4_4_ + auVar21._4_4_ * fVar212 + fVar216 * auVar20._4_4_;
  auVar152._8_4_ = fVar237 * auVar19._8_4_ + auVar21._8_4_ * fVar235 + fVar240 * auVar20._8_4_;
  auVar152._12_4_ = fVar215 * auVar19._12_4_ + auVar21._12_4_ * fVar213 + fVar217 * auVar20._12_4_;
  auVar152._16_4_ = fVar236 * auVar19._16_4_ + auVar21._16_4_ * fVar218 + fVar238 * auVar20._16_4_;
  auVar152._20_4_ = fVar214 * auVar19._20_4_ + auVar21._20_4_ * fVar212 + fVar216 * auVar20._20_4_;
  auVar152._24_4_ = fVar237 * auVar19._24_4_ + auVar21._24_4_ * fVar235 + fVar240 * auVar20._24_4_;
  auVar152._28_4_ = fVar192 + auVar21._28_4_ + auVar18._28_4_;
  auVar165._8_4_ = 0x7fffffff;
  auVar165._0_8_ = 0x7fffffff7fffffff;
  auVar165._12_4_ = 0x7fffffff;
  auVar165._16_4_ = 0x7fffffff;
  auVar165._20_4_ = 0x7fffffff;
  auVar165._24_4_ = 0x7fffffff;
  auVar165._28_4_ = 0x7fffffff;
  auVar183._8_4_ = 0x219392ef;
  auVar183._0_8_ = 0x219392ef219392ef;
  auVar183._12_4_ = 0x219392ef;
  auVar183._16_4_ = 0x219392ef;
  auVar183._20_4_ = 0x219392ef;
  auVar183._24_4_ = 0x219392ef;
  auVar183._28_4_ = 0x219392ef;
  auVar90 = vandps_avx(auVar309,auVar165);
  auVar90 = vcmpps_avx(auVar90,auVar183,1);
  auVar17 = vblendvps_avx(auVar309,auVar183,auVar90);
  auVar90 = vandps_avx(auVar300,auVar165);
  auVar90 = vcmpps_avx(auVar90,auVar183,1);
  auVar18 = vblendvps_avx(auVar300,auVar183,auVar90);
  auVar90 = vandps_avx(auVar208,auVar165);
  auVar90 = vcmpps_avx(auVar90,auVar183,1);
  auVar90 = vblendvps_avx(auVar208,auVar183,auVar90);
  auVar166._0_4_ = fVar236 * auVar22._0_4_ + fVar238 * auVar23._0_4_ + auVar24._0_4_ * fVar218;
  auVar166._4_4_ = fVar214 * auVar22._4_4_ + fVar216 * auVar23._4_4_ + auVar24._4_4_ * fVar212;
  auVar166._8_4_ = fVar237 * auVar22._8_4_ + fVar240 * auVar23._8_4_ + auVar24._8_4_ * fVar235;
  auVar166._12_4_ = fVar215 * auVar22._12_4_ + fVar217 * auVar23._12_4_ + auVar24._12_4_ * fVar213;
  auVar166._16_4_ = fVar236 * auVar22._16_4_ + fVar238 * auVar23._16_4_ + auVar24._16_4_ * fVar218;
  auVar166._20_4_ = fVar214 * auVar22._20_4_ + fVar216 * auVar23._20_4_ + auVar24._20_4_ * fVar212;
  auVar166._24_4_ = fVar237 * auVar22._24_4_ + fVar240 * auVar23._24_4_ + auVar24._24_4_ * fVar235;
  auVar166._28_4_ = fVar192 + auVar20._28_4_ + fVar213;
  auVar19 = vrcpps_avx(auVar17);
  fVar192 = auVar19._0_4_;
  fVar212 = auVar19._4_4_;
  auVar20._4_4_ = auVar17._4_4_ * fVar212;
  auVar20._0_4_ = auVar17._0_4_ * fVar192;
  fVar213 = auVar19._8_4_;
  auVar20._8_4_ = auVar17._8_4_ * fVar213;
  fVar214 = auVar19._12_4_;
  auVar20._12_4_ = auVar17._12_4_ * fVar214;
  fVar215 = auVar19._16_4_;
  auVar20._16_4_ = auVar17._16_4_ * fVar215;
  fVar216 = auVar19._20_4_;
  auVar20._20_4_ = auVar17._20_4_ * fVar216;
  fVar217 = auVar19._24_4_;
  auVar20._24_4_ = auVar17._24_4_ * fVar217;
  auVar20._28_4_ = auVar208._28_4_;
  auVar251._8_4_ = 0x3f800000;
  auVar251._0_8_ = 0x3f8000003f800000;
  auVar251._12_4_ = 0x3f800000;
  auVar251._16_4_ = 0x3f800000;
  auVar251._20_4_ = 0x3f800000;
  auVar251._24_4_ = 0x3f800000;
  auVar251._28_4_ = 0x3f800000;
  auVar20 = vsubps_avx(auVar251,auVar20);
  auVar17 = vrcpps_avx(auVar18);
  fVar192 = fVar192 + fVar192 * auVar20._0_4_;
  fVar212 = fVar212 + fVar212 * auVar20._4_4_;
  fVar213 = fVar213 + fVar213 * auVar20._8_4_;
  fVar214 = fVar214 + fVar214 * auVar20._12_4_;
  fVar215 = fVar215 + fVar215 * auVar20._16_4_;
  fVar216 = fVar216 + fVar216 * auVar20._20_4_;
  fVar217 = fVar217 + fVar217 * auVar20._24_4_;
  fVar218 = auVar17._0_4_;
  fVar235 = auVar17._4_4_;
  auVar21._4_4_ = auVar18._4_4_ * fVar235;
  auVar21._0_4_ = auVar18._0_4_ * fVar218;
  fVar236 = auVar17._8_4_;
  auVar21._8_4_ = auVar18._8_4_ * fVar236;
  fVar237 = auVar17._12_4_;
  auVar21._12_4_ = auVar18._12_4_ * fVar237;
  fVar238 = auVar17._16_4_;
  auVar21._16_4_ = auVar18._16_4_ * fVar238;
  fVar240 = auVar17._20_4_;
  auVar21._20_4_ = auVar18._20_4_ * fVar240;
  fVar241 = auVar17._24_4_;
  auVar21._24_4_ = auVar18._24_4_ * fVar241;
  auVar21._28_4_ = auVar19._28_4_;
  auVar17 = vsubps_avx(auVar251,auVar21);
  fVar218 = fVar218 + fVar218 * auVar17._0_4_;
  fVar235 = fVar235 + fVar235 * auVar17._4_4_;
  fVar236 = fVar236 + fVar236 * auVar17._8_4_;
  fVar237 = fVar237 + fVar237 * auVar17._12_4_;
  fVar238 = fVar238 + fVar238 * auVar17._16_4_;
  fVar240 = fVar240 + fVar240 * auVar17._20_4_;
  fVar241 = fVar241 + fVar241 * auVar17._24_4_;
  auVar17 = vrcpps_avx(auVar90);
  fVar168 = auVar17._0_4_;
  fVar186 = auVar17._4_4_;
  auVar18._4_4_ = fVar186 * auVar90._4_4_;
  auVar18._0_4_ = fVar168 * auVar90._0_4_;
  fVar187 = auVar17._8_4_;
  auVar18._8_4_ = fVar187 * auVar90._8_4_;
  fVar188 = auVar17._12_4_;
  auVar18._12_4_ = fVar188 * auVar90._12_4_;
  fVar189 = auVar17._16_4_;
  auVar18._16_4_ = fVar189 * auVar90._16_4_;
  fVar190 = auVar17._20_4_;
  auVar18._20_4_ = fVar190 * auVar90._20_4_;
  fVar191 = auVar17._24_4_;
  auVar18._24_4_ = fVar191 * auVar90._24_4_;
  auVar18._28_4_ = auVar90._28_4_;
  auVar90 = vsubps_avx(auVar251,auVar18);
  fVar168 = fVar168 + fVar168 * auVar90._0_4_;
  fVar186 = fVar186 + fVar186 * auVar90._4_4_;
  fVar187 = fVar187 + fVar187 * auVar90._8_4_;
  fVar188 = fVar188 + fVar188 * auVar90._12_4_;
  fVar189 = fVar189 + fVar189 * auVar90._16_4_;
  fVar190 = fVar190 + fVar190 * auVar90._20_4_;
  fVar191 = fVar191 + fVar191 * auVar90._24_4_;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar150 = vpmovsxwd_avx(auVar150);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar68 * 7 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar223);
  auVar91._16_16_ = auVar223;
  auVar91._0_16_ = auVar150;
  auVar90 = vcvtdq2ps_avx(auVar91);
  auVar90 = vsubps_avx(auVar90,auVar122);
  auVar75._0_4_ = fVar192 * auVar90._0_4_;
  auVar75._4_4_ = fVar212 * auVar90._4_4_;
  auVar75._8_4_ = fVar213 * auVar90._8_4_;
  auVar75._12_4_ = fVar214 * auVar90._12_4_;
  auVar19._16_4_ = fVar215 * auVar90._16_4_;
  auVar19._0_16_ = auVar75;
  auVar19._20_4_ = fVar216 * auVar90._20_4_;
  auVar19._24_4_ = fVar217 * auVar90._24_4_;
  auVar19._28_4_ = auVar90._28_4_;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *(ulong *)(prim + lVar15 + 6);
  auVar150 = vpmovsxwd_avx(auVar148);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + lVar15 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar8);
  auVar252._16_16_ = auVar223;
  auVar252._0_16_ = auVar150;
  auVar90 = vcvtdq2ps_avx(auVar252);
  auVar90 = vsubps_avx(auVar90,auVar122);
  auVar102._0_4_ = fVar192 * auVar90._0_4_;
  auVar102._4_4_ = fVar212 * auVar90._4_4_;
  auVar102._8_4_ = fVar213 * auVar90._8_4_;
  auVar102._12_4_ = fVar214 * auVar90._12_4_;
  auVar22._16_4_ = fVar215 * auVar90._16_4_;
  auVar22._0_16_ = auVar102;
  auVar22._20_4_ = fVar216 * auVar90._20_4_;
  auVar22._24_4_ = fVar217 * auVar90._24_4_;
  auVar22._28_4_ = auVar90._28_4_;
  lVar71 = (ulong)(byte)PVar10 * 0x10;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = *(ulong *)(prim + lVar71 + 6);
  auVar150 = vpmovsxwd_avx(auVar295);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar71 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar9);
  lVar71 = lVar71 + uVar68 * -2;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + lVar71 + 6);
  auVar148 = vpmovsxwd_avx(auVar117);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + lVar71 + 0xe);
  auVar8 = vpmovsxwd_avx(auVar106);
  auVar209._16_16_ = auVar8;
  auVar209._0_16_ = auVar148;
  auVar90 = vcvtdq2ps_avx(auVar209);
  auVar90 = vsubps_avx(auVar90,auVar152);
  auVar194._0_4_ = fVar218 * auVar90._0_4_;
  auVar194._4_4_ = fVar235 * auVar90._4_4_;
  auVar194._8_4_ = fVar236 * auVar90._8_4_;
  auVar194._12_4_ = fVar237 * auVar90._12_4_;
  auVar23._16_4_ = fVar238 * auVar90._16_4_;
  auVar23._0_16_ = auVar194;
  auVar23._20_4_ = fVar240 * auVar90._20_4_;
  auVar23._24_4_ = fVar241 * auVar90._24_4_;
  auVar23._28_4_ = auVar90._28_4_;
  auVar253._16_16_ = auVar223;
  auVar253._0_16_ = auVar150;
  auVar90 = vcvtdq2ps_avx(auVar253);
  auVar90 = vsubps_avx(auVar90,auVar152);
  auVar131._0_4_ = fVar218 * auVar90._0_4_;
  auVar131._4_4_ = fVar235 * auVar90._4_4_;
  auVar131._8_4_ = fVar236 * auVar90._8_4_;
  auVar131._12_4_ = fVar237 * auVar90._12_4_;
  auVar24._16_4_ = fVar238 * auVar90._16_4_;
  auVar24._0_16_ = auVar131;
  auVar24._20_4_ = fVar240 * auVar90._20_4_;
  auVar24._24_4_ = fVar241 * auVar90._24_4_;
  auVar24._28_4_ = auVar90._28_4_;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar72 + uVar68 + 6);
  auVar150 = vpmovsxwd_avx(auVar138);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar72 + uVar68 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar107);
  auVar232._16_16_ = auVar223;
  auVar232._0_16_ = auVar150;
  auVar90 = vcvtdq2ps_avx(auVar232);
  auVar90 = vsubps_avx(auVar90,auVar166);
  auVar219._0_4_ = fVar168 * auVar90._0_4_;
  auVar219._4_4_ = fVar186 * auVar90._4_4_;
  auVar219._8_4_ = fVar187 * auVar90._8_4_;
  auVar219._12_4_ = fVar188 * auVar90._12_4_;
  auVar25._16_4_ = fVar189 * auVar90._16_4_;
  auVar25._0_16_ = auVar219;
  auVar25._20_4_ = fVar190 * auVar90._20_4_;
  auVar25._24_4_ = fVar191 * auVar90._24_4_;
  auVar25._28_4_ = auVar90._28_4_;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = *(ulong *)(prim + uVar68 * 0x17 + 6);
  auVar150 = vpmovsxwd_avx(auVar239);
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *(ulong *)(prim + uVar68 * 0x17 + 0xe);
  auVar223 = vpmovsxwd_avx(auVar269);
  auVar254._16_16_ = auVar223;
  auVar254._0_16_ = auVar150;
  auVar90 = vcvtdq2ps_avx(auVar254);
  auVar90 = vsubps_avx(auVar90,auVar166);
  auVar157._0_4_ = fVar168 * auVar90._0_4_;
  auVar157._4_4_ = fVar186 * auVar90._4_4_;
  auVar157._8_4_ = fVar187 * auVar90._8_4_;
  auVar157._12_4_ = fVar188 * auVar90._12_4_;
  auVar26._16_4_ = fVar189 * auVar90._16_4_;
  auVar26._0_16_ = auVar157;
  auVar26._20_4_ = fVar190 * auVar90._20_4_;
  auVar26._24_4_ = fVar191 * auVar90._24_4_;
  auVar26._28_4_ = auVar90._28_4_;
  auVar150 = vpminsd_avx(auVar19._16_16_,auVar22._16_16_);
  auVar223 = vpminsd_avx(auVar75,auVar102);
  auVar291._16_16_ = auVar150;
  auVar291._0_16_ = auVar223;
  auVar150 = vpminsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar223 = vpminsd_avx(auVar194,auVar131);
  auVar301._16_16_ = auVar150;
  auVar301._0_16_ = auVar223;
  auVar90 = vmaxps_avx(auVar291,auVar301);
  auVar150 = vpminsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar223 = vpminsd_avx(auVar219,auVar157);
  auVar321._16_16_ = auVar150;
  auVar321._0_16_ = auVar223;
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar331._4_4_ = uVar6;
  auVar331._0_4_ = uVar6;
  auVar331._8_4_ = uVar6;
  auVar331._12_4_ = uVar6;
  auVar331._16_4_ = uVar6;
  auVar331._20_4_ = uVar6;
  auVar331._24_4_ = uVar6;
  auVar331._28_4_ = uVar6;
  auVar17 = vmaxps_avx(auVar321,auVar331);
  auVar90 = vmaxps_avx(auVar90,auVar17);
  local_2e0._4_4_ = auVar90._4_4_ * 0.99999964;
  local_2e0._0_4_ = auVar90._0_4_ * 0.99999964;
  local_2e0._8_4_ = auVar90._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar90._12_4_ * 0.99999964;
  local_2e0._16_4_ = auVar90._16_4_ * 0.99999964;
  local_2e0._20_4_ = auVar90._20_4_ * 0.99999964;
  local_2e0._24_4_ = auVar90._24_4_ * 0.99999964;
  local_2e0._28_4_ = auVar90._28_4_;
  auVar150 = vpmaxsd_avx(auVar19._16_16_,auVar22._16_16_);
  auVar223 = vpmaxsd_avx(auVar75,auVar102);
  auVar92._16_16_ = auVar150;
  auVar92._0_16_ = auVar223;
  auVar150 = vpmaxsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar223 = vpmaxsd_avx(auVar194,auVar131);
  auVar123._16_16_ = auVar150;
  auVar123._0_16_ = auVar223;
  auVar90 = vminps_avx(auVar92,auVar123);
  auVar150 = vpmaxsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar223 = vpmaxsd_avx(auVar219,auVar157);
  auVar124._16_16_ = auVar150;
  auVar124._0_16_ = auVar223;
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar153._4_4_ = uVar6;
  auVar153._0_4_ = uVar6;
  auVar153._8_4_ = uVar6;
  auVar153._12_4_ = uVar6;
  auVar153._16_4_ = uVar6;
  auVar153._20_4_ = uVar6;
  auVar153._24_4_ = uVar6;
  auVar153._28_4_ = uVar6;
  auVar17 = vminps_avx(auVar124,auVar153);
  auVar90 = vminps_avx(auVar90,auVar17);
  auVar17._4_4_ = auVar90._4_4_ * 1.0000004;
  auVar17._0_4_ = auVar90._0_4_ * 1.0000004;
  auVar17._8_4_ = auVar90._8_4_ * 1.0000004;
  auVar17._12_4_ = auVar90._12_4_ * 1.0000004;
  auVar17._16_4_ = auVar90._16_4_ * 1.0000004;
  auVar17._20_4_ = auVar90._20_4_ * 1.0000004;
  auVar17._24_4_ = auVar90._24_4_ * 1.0000004;
  auVar17._28_4_ = auVar90._28_4_;
  auVar90 = vcmpps_avx(local_2e0,auVar17,2);
  auVar150 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar125._16_16_ = auVar150;
  auVar125._0_16_ = auVar150;
  auVar17 = vcvtdq2ps_avx(auVar125);
  auVar17 = vcmpps_avx(_DAT_01faff40,auVar17,1);
  auVar90 = vandps_avx(auVar90,auVar17);
  uVar65 = vmovmskps_avx(auVar90);
  if (uVar65 == 0) {
    return false;
  }
  uVar65 = uVar65 & 0xff;
  auVar93._16_16_ = mm_lookupmask_ps._240_16_;
  auVar93._0_16_ = mm_lookupmask_ps._240_16_;
  uVar69 = 1 << ((byte)k & 0x1f);
  local_2c0 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,0x80);
LAB_0100d753:
  uVar68 = (ulong)uVar65;
  lVar71 = 0;
  if (uVar68 != 0) {
    for (; (uVar65 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
    }
  }
  uVar65 = *(uint *)(prim + 2);
  pGVar11 = (context->scene->geometries).items[uVar65].ptr;
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                           pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar71 * 4 + 6));
  p_Var12 = pGVar11[1].intersectionFilterN;
  pvVar13 = pGVar11[2].userPtr;
  _Var14 = pGVar11[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var14 + uVar72 * (long)pvVar13);
  fVar192 = *pfVar1;
  fVar218 = pfVar1[1];
  fVar212 = pfVar1[2];
  fVar235 = pfVar1[3];
  pfVar1 = (float *)(_Var14 + (uVar72 + 1) * (long)pvVar13);
  pfVar2 = (float *)(_Var14 + (uVar72 + 2) * (long)pvVar13);
  pfVar3 = (float *)(_Var14 + (long)pvVar13 * (uVar72 + 3));
  fVar213 = *pfVar3;
  fVar236 = pfVar3[1];
  fVar214 = pfVar3[2];
  fVar237 = pfVar3[3];
  uVar68 = uVar68 - 1 & uVar68;
  lVar15 = *(long *)&pGVar11[1].time_range.upper;
  pfVar3 = (float *)(lVar15 + (long)p_Var12 * uVar72);
  fVar215 = *pfVar3;
  fVar238 = pfVar3[1];
  fVar216 = pfVar3[2];
  fVar240 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + (long)p_Var12 * (uVar72 + 1));
  pfVar4 = (float *)(lVar15 + (long)p_Var12 * (uVar72 + 2));
  lVar16 = 0;
  if (uVar68 != 0) {
    for (; (uVar68 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
    }
  }
  pfVar5 = (float *)(lVar15 + (long)p_Var12 * (uVar72 + 3));
  fVar217 = *pfVar5;
  fVar241 = pfVar5[1];
  fVar168 = pfVar5[2];
  fVar186 = pfVar5[3];
  if (((uVar68 != 0) && (uVar72 = uVar68 - 1 & uVar68, uVar72 != 0)) && (lVar15 = 0, uVar72 != 0)) {
    for (; (uVar72 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
    }
  }
  auVar150 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar148 = vinsertps_avx(auVar150,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar187 = *pfVar4 * 0.0;
  fVar188 = pfVar4[1] * 0.0;
  fVar189 = pfVar4[2] * 0.0;
  fVar190 = pfVar4[3] * 0.0;
  fVar191 = fVar187 + fVar217 * 0.0;
  fVar303 = fVar188 + fVar241 * 0.0;
  fVar304 = fVar189 + fVar168 * 0.0;
  fVar305 = fVar190 + fVar186 * 0.0;
  fVar306 = *pfVar3 * 0.0;
  fVar310 = pfVar3[1] * 0.0;
  fVar311 = pfVar3[2] * 0.0;
  fVar312 = pfVar3[3] * 0.0;
  local_6a0._0_4_ = fVar215 + fVar306 + fVar191;
  local_6a0._4_4_ = fVar238 + fVar310 + fVar303;
  fStack_698 = fVar216 + fVar311 + fVar304;
  fStack_694 = fVar240 + fVar312 + fVar305;
  auVar132._0_4_ = fVar191 + *pfVar3 * 3.0;
  auVar132._4_4_ = fVar303 + pfVar3[1] * 3.0;
  auVar132._8_4_ = fVar304 + pfVar3[2] * 3.0;
  auVar132._12_4_ = fVar305 + pfVar3[3] * 3.0;
  auVar293._0_4_ = fVar215 * 3.0;
  auVar293._4_4_ = fVar238 * 3.0;
  auVar293._8_4_ = fVar216 * 3.0;
  auVar293._12_4_ = fVar240 * 3.0;
  auVar138 = vsubps_avx(auVar132,auVar293);
  fVar317 = *pfVar2 * 0.0;
  fVar323 = pfVar2[1] * 0.0;
  fVar324 = pfVar2[2] * 0.0;
  fVar325 = pfVar2[3] * 0.0;
  fVar191 = fVar317 + fVar213 * 0.0;
  fVar303 = fVar323 + fVar236 * 0.0;
  fVar304 = fVar324 + fVar214 * 0.0;
  fVar305 = fVar325 + fVar237 * 0.0;
  fVar327 = *pfVar1 * 0.0;
  fVar333 = pfVar1[1] * 0.0;
  fVar334 = pfVar1[2] * 0.0;
  fVar335 = pfVar1[3] * 0.0;
  auVar336._0_4_ = fVar327 + fVar191 + fVar192;
  auVar336._4_4_ = fVar333 + fVar303 + fVar218;
  auVar336._8_4_ = fVar334 + fVar304 + fVar212;
  auVar336._12_4_ = fVar335 + fVar305 + fVar235;
  auVar158._0_4_ = fVar191 + *pfVar1 * 3.0;
  auVar158._4_4_ = fVar303 + pfVar1[1] * 3.0;
  auVar158._8_4_ = fVar304 + pfVar1[2] * 3.0;
  auVar158._12_4_ = fVar305 + pfVar1[3] * 3.0;
  auVar294._0_4_ = fVar192 * 3.0;
  auVar294._4_4_ = fVar218 * 3.0;
  auVar294._8_4_ = fVar212 * 3.0;
  auVar294._12_4_ = fVar235 * 3.0;
  auVar295 = vsubps_avx(auVar158,auVar294);
  auVar256._0_4_ = fVar215 * 0.0;
  auVar256._4_4_ = fVar238 * 0.0;
  auVar256._8_4_ = fVar216 * 0.0;
  auVar256._12_4_ = fVar240 * 0.0;
  auVar159._0_4_ = auVar256._0_4_ + fVar306 + fVar187 + fVar217;
  auVar159._4_4_ = auVar256._4_4_ + fVar310 + fVar188 + fVar241;
  auVar159._8_4_ = auVar256._8_4_ + fVar311 + fVar189 + fVar168;
  auVar159._12_4_ = auVar256._12_4_ + fVar312 + fVar190 + fVar186;
  auVar265._0_4_ = fVar217 * 3.0;
  auVar265._4_4_ = fVar241 * 3.0;
  auVar265._8_4_ = fVar168 * 3.0;
  auVar265._12_4_ = fVar186 * 3.0;
  auVar169._0_4_ = *pfVar4 * 3.0;
  auVar169._4_4_ = pfVar4[1] * 3.0;
  auVar169._8_4_ = pfVar4[2] * 3.0;
  auVar169._12_4_ = pfVar4[3] * 3.0;
  auVar150 = vsubps_avx(auVar265,auVar169);
  auVar170._0_4_ = fVar306 + auVar150._0_4_;
  auVar170._4_4_ = fVar310 + auVar150._4_4_;
  auVar170._8_4_ = fVar311 + auVar150._8_4_;
  auVar170._12_4_ = fVar312 + auVar150._12_4_;
  auVar107 = vsubps_avx(auVar170,auVar256);
  auVar195._0_4_ = fVar192 * 0.0;
  auVar195._4_4_ = fVar218 * 0.0;
  auVar195._8_4_ = fVar212 * 0.0;
  auVar195._12_4_ = fVar235 * 0.0;
  auVar266._0_4_ = fVar327 + fVar317 + fVar213 + auVar195._0_4_;
  auVar266._4_4_ = fVar333 + fVar323 + fVar236 + auVar195._4_4_;
  auVar266._8_4_ = fVar334 + fVar324 + fVar214 + auVar195._8_4_;
  auVar266._12_4_ = fVar335 + fVar325 + fVar237 + auVar195._12_4_;
  auVar242._0_4_ = fVar213 * 3.0;
  auVar242._4_4_ = fVar236 * 3.0;
  auVar242._8_4_ = fVar214 * 3.0;
  auVar242._12_4_ = fVar237 * 3.0;
  auVar220._0_4_ = *pfVar2 * 3.0;
  auVar220._4_4_ = pfVar2[1] * 3.0;
  auVar220._8_4_ = pfVar2[2] * 3.0;
  auVar220._12_4_ = pfVar2[3] * 3.0;
  auVar150 = vsubps_avx(auVar242,auVar220);
  auVar221._0_4_ = fVar327 + auVar150._0_4_;
  auVar221._4_4_ = fVar333 + auVar150._4_4_;
  auVar221._8_4_ = fVar334 + auVar150._8_4_;
  auVar221._12_4_ = fVar335 + auVar150._12_4_;
  auVar117 = vsubps_avx(auVar221,auVar195);
  auVar150 = vshufps_avx(auVar138,auVar138,0xc9);
  auVar223 = vshufps_avx(auVar336,auVar336,0xc9);
  fVar189 = auVar138._0_4_;
  auVar243._0_4_ = fVar189 * auVar223._0_4_;
  fVar190 = auVar138._4_4_;
  auVar243._4_4_ = fVar190 * auVar223._4_4_;
  fVar191 = auVar138._8_4_;
  auVar243._8_4_ = fVar191 * auVar223._8_4_;
  fVar303 = auVar138._12_4_;
  auVar243._12_4_ = fVar303 * auVar223._12_4_;
  auVar257._0_4_ = auVar336._0_4_ * auVar150._0_4_;
  auVar257._4_4_ = auVar336._4_4_ * auVar150._4_4_;
  auVar257._8_4_ = auVar336._8_4_ * auVar150._8_4_;
  auVar257._12_4_ = auVar336._12_4_ * auVar150._12_4_;
  auVar223 = vsubps_avx(auVar257,auVar243);
  auVar8 = vshufps_avx(auVar223,auVar223,0xc9);
  auVar223 = vshufps_avx(auVar295,auVar295,0xc9);
  auVar244._0_4_ = fVar189 * auVar223._0_4_;
  auVar244._4_4_ = fVar190 * auVar223._4_4_;
  auVar244._8_4_ = fVar191 * auVar223._8_4_;
  auVar244._12_4_ = fVar303 * auVar223._12_4_;
  auVar196._0_4_ = auVar295._0_4_ * auVar150._0_4_;
  auVar196._4_4_ = auVar295._4_4_ * auVar150._4_4_;
  auVar196._8_4_ = auVar295._8_4_ * auVar150._8_4_;
  auVar196._12_4_ = auVar295._12_4_ * auVar150._12_4_;
  auVar150 = vsubps_avx(auVar196,auVar244);
  auVar295 = vshufps_avx(auVar150,auVar150,0xc9);
  auVar223 = vshufps_avx(auVar107,auVar107,0xc9);
  auVar150 = vshufps_avx(auVar266,auVar266,0xc9);
  fVar304 = auVar107._0_4_;
  auVar197._0_4_ = fVar304 * auVar150._0_4_;
  fVar305 = auVar107._4_4_;
  auVar197._4_4_ = fVar305 * auVar150._4_4_;
  fVar306 = auVar107._8_4_;
  auVar197._8_4_ = fVar306 * auVar150._8_4_;
  fVar310 = auVar107._12_4_;
  auVar197._12_4_ = fVar310 * auVar150._12_4_;
  auVar267._0_4_ = auVar266._0_4_ * auVar223._0_4_;
  auVar267._4_4_ = auVar266._4_4_ * auVar223._4_4_;
  auVar267._8_4_ = auVar266._8_4_ * auVar223._8_4_;
  auVar267._12_4_ = auVar266._12_4_ * auVar223._12_4_;
  auVar150 = vsubps_avx(auVar267,auVar197);
  auVar9 = vshufps_avx(auVar150,auVar150,0xc9);
  auVar150 = vshufps_avx(auVar117,auVar117,0xc9);
  auVar268._0_4_ = auVar150._0_4_ * fVar304;
  auVar268._4_4_ = auVar150._4_4_ * fVar305;
  auVar268._8_4_ = auVar150._8_4_ * fVar306;
  auVar268._12_4_ = auVar150._12_4_ * fVar310;
  auVar150 = vdpps_avx(auVar8,auVar8,0x7f);
  auVar222._0_4_ = auVar223._0_4_ * auVar117._0_4_;
  auVar222._4_4_ = auVar223._4_4_ * auVar117._4_4_;
  auVar222._8_4_ = auVar223._8_4_ * auVar117._8_4_;
  auVar222._12_4_ = auVar223._12_4_ * auVar117._12_4_;
  auVar223 = vsubps_avx(auVar222,auVar268);
  auVar117 = vshufps_avx(auVar223,auVar223,0xc9);
  fVar213 = auVar150._0_4_;
  auVar269 = ZEXT416((uint)fVar213);
  auVar223 = vrsqrtss_avx(auVar269,auVar269);
  fVar192 = auVar223._0_4_;
  auVar223 = ZEXT416((uint)(fVar192 * 1.5 - fVar213 * 0.5 * fVar192 * fVar192 * fVar192));
  auVar106 = vshufps_avx(auVar223,auVar223,0);
  auVar223 = vdpps_avx(auVar8,auVar295,0x7f);
  fVar192 = auVar8._0_4_ * auVar106._0_4_;
  fVar218 = auVar8._4_4_ * auVar106._4_4_;
  fVar212 = auVar8._8_4_ * auVar106._8_4_;
  fVar235 = auVar8._12_4_ * auVar106._12_4_;
  auVar150 = vshufps_avx(auVar150,auVar150,0);
  auVar286._0_4_ = auVar295._0_4_ * auVar150._0_4_;
  auVar286._4_4_ = auVar295._4_4_ * auVar150._4_4_;
  auVar286._8_4_ = auVar295._8_4_ * auVar150._8_4_;
  auVar286._12_4_ = auVar295._12_4_ * auVar150._12_4_;
  auVar150 = vshufps_avx(auVar223,auVar223,0);
  auVar258._0_4_ = auVar8._0_4_ * auVar150._0_4_;
  auVar258._4_4_ = auVar8._4_4_ * auVar150._4_4_;
  auVar258._8_4_ = auVar8._8_4_ * auVar150._8_4_;
  auVar258._12_4_ = auVar8._12_4_ * auVar150._12_4_;
  auVar239 = vsubps_avx(auVar286,auVar258);
  auVar150 = vrcpss_avx(auVar269,auVar269);
  auVar150 = ZEXT416((uint)(auVar150._0_4_ * (2.0 - fVar213 * auVar150._0_4_)));
  auVar8 = vshufps_avx(auVar150,auVar150,0);
  auVar150 = vdpps_avx(auVar9,auVar9,0x7f);
  fVar213 = auVar150._0_4_;
  auVar269 = ZEXT416((uint)fVar213);
  auVar223 = vrsqrtss_avx(auVar269,auVar269);
  fVar236 = auVar223._0_4_;
  auVar223 = vdpps_avx(auVar9,auVar117,0x7f);
  auVar295 = ZEXT416((uint)(fVar236 * 1.5 - fVar213 * 0.5 * fVar236 * fVar236 * fVar236));
  auVar295 = vshufps_avx(auVar295,auVar295,0);
  fVar236 = auVar295._0_4_ * auVar9._0_4_;
  fVar214 = auVar295._4_4_ * auVar9._4_4_;
  fVar237 = auVar295._8_4_ * auVar9._8_4_;
  fVar215 = auVar295._12_4_ * auVar9._12_4_;
  auVar150 = vshufps_avx(auVar150,auVar150,0);
  auVar245._0_4_ = auVar150._0_4_ * auVar117._0_4_;
  auVar245._4_4_ = auVar150._4_4_ * auVar117._4_4_;
  auVar245._8_4_ = auVar150._8_4_ * auVar117._8_4_;
  auVar245._12_4_ = auVar150._12_4_ * auVar117._12_4_;
  auVar150 = vshufps_avx(auVar223,auVar223,0);
  auVar198._0_4_ = auVar150._0_4_ * auVar9._0_4_;
  auVar198._4_4_ = auVar150._4_4_ * auVar9._4_4_;
  auVar198._8_4_ = auVar150._8_4_ * auVar9._8_4_;
  auVar198._12_4_ = auVar150._12_4_ * auVar9._12_4_;
  auVar117 = vsubps_avx(auVar245,auVar198);
  auVar150 = vrcpss_avx(auVar269,auVar269);
  auVar150 = ZEXT416((uint)((2.0 - fVar213 * auVar150._0_4_) * auVar150._0_4_));
  auVar150 = vshufps_avx(auVar150,auVar150,0);
  auVar223 = vshufps_avx(_local_6a0,_local_6a0,0xff);
  auVar270._0_4_ = auVar223._0_4_ * fVar192;
  auVar270._4_4_ = auVar223._4_4_ * fVar218;
  auVar270._8_4_ = auVar223._8_4_ * fVar212;
  auVar270._12_4_ = auVar223._12_4_ * fVar235;
  _local_4e0 = vsubps_avx(_local_6a0,auVar270);
  auVar9 = vshufps_avx(auVar138,auVar138,0xff);
  auVar224._0_4_ =
       auVar9._0_4_ * fVar192 + auVar106._0_4_ * auVar239._0_4_ * auVar8._0_4_ * auVar223._0_4_;
  auVar224._4_4_ =
       auVar9._4_4_ * fVar218 + auVar106._4_4_ * auVar239._4_4_ * auVar8._4_4_ * auVar223._4_4_;
  auVar224._8_4_ =
       auVar9._8_4_ * fVar212 + auVar106._8_4_ * auVar239._8_4_ * auVar8._8_4_ * auVar223._8_4_;
  auVar224._12_4_ =
       auVar9._12_4_ * fVar235 + auVar106._12_4_ * auVar239._12_4_ * auVar8._12_4_ * auVar223._12_4_
  ;
  auVar9 = vsubps_avx(auVar138,auVar224);
  local_4f0._0_4_ = auVar270._0_4_ + (float)local_6a0._0_4_;
  local_4f0._4_4_ = auVar270._4_4_ + (float)local_6a0._4_4_;
  fStack_4e8 = auVar270._8_4_ + fStack_698;
  fStack_4e4 = auVar270._12_4_ + fStack_694;
  auVar223 = vshufps_avx(auVar159,auVar159,0xff);
  auVar133._0_4_ = fVar236 * auVar223._0_4_;
  auVar133._4_4_ = fVar214 * auVar223._4_4_;
  auVar133._8_4_ = fVar237 * auVar223._8_4_;
  auVar133._12_4_ = fVar215 * auVar223._12_4_;
  _local_500 = vsubps_avx(auVar159,auVar133);
  auVar8 = vshufps_avx(auVar107,auVar107,0xff);
  auVar103._0_4_ =
       fVar236 * auVar8._0_4_ + auVar223._0_4_ * auVar295._0_4_ * auVar117._0_4_ * auVar150._0_4_;
  auVar103._4_4_ =
       fVar214 * auVar8._4_4_ + auVar223._4_4_ * auVar295._4_4_ * auVar117._4_4_ * auVar150._4_4_;
  auVar103._8_4_ =
       fVar237 * auVar8._8_4_ + auVar223._8_4_ * auVar295._8_4_ * auVar117._8_4_ * auVar150._8_4_;
  auVar103._12_4_ =
       fVar215 * auVar8._12_4_ +
       auVar223._12_4_ * auVar295._12_4_ * auVar117._12_4_ * auVar150._12_4_;
  auVar295 = vsubps_avx(auVar107,auVar103);
  local_510._0_4_ = auVar159._0_4_ + auVar133._0_4_;
  local_510._4_4_ = auVar159._4_4_ + auVar133._4_4_;
  fStack_508 = auVar159._8_4_ + auVar133._8_4_;
  fStack_504 = auVar159._12_4_ + auVar133._12_4_;
  local_520._0_4_ = local_4e0._0_4_ + auVar9._0_4_ * 0.33333334;
  local_520._4_4_ = local_4e0._4_4_ + auVar9._4_4_ * 0.33333334;
  fStack_518 = local_4e0._8_4_ + auVar9._8_4_ * 0.33333334;
  fStack_514 = local_4e0._12_4_ + auVar9._12_4_ * 0.33333334;
  local_3a0 = vsubps_avx(_local_4e0,auVar148);
  auVar223 = vmovsldup_avx(local_3a0);
  auVar150 = vmovshdup_avx(local_3a0);
  auVar8 = vshufps_avx(local_3a0,local_3a0,0xaa);
  fVar192 = pre->ray_space[k].vx.field_0.m128[0];
  fVar218 = pre->ray_space[k].vx.field_0.m128[1];
  fVar212 = pre->ray_space[k].vx.field_0.m128[2];
  fVar235 = pre->ray_space[k].vx.field_0.m128[3];
  fVar213 = pre->ray_space[k].vy.field_0.m128[0];
  fVar236 = pre->ray_space[k].vy.field_0.m128[1];
  fVar214 = pre->ray_space[k].vy.field_0.m128[2];
  fVar237 = pre->ray_space[k].vy.field_0.m128[3];
  fVar215 = pre->ray_space[k].vz.field_0.m128[0];
  fVar238 = pre->ray_space[k].vz.field_0.m128[1];
  fVar216 = pre->ray_space[k].vz.field_0.m128[2];
  fVar240 = pre->ray_space[k].vz.field_0.m128[3];
  fVar217 = fVar192 * auVar223._0_4_ + auVar8._0_4_ * fVar215 + fVar213 * auVar150._0_4_;
  fVar186 = fVar218 * auVar223._4_4_ + auVar8._4_4_ * fVar238 + fVar236 * auVar150._4_4_;
  local_640._4_4_ = fVar186;
  local_640._0_4_ = fVar217;
  fStack_638 = fVar212 * auVar223._8_4_ + auVar8._8_4_ * fVar216 + fVar214 * auVar150._8_4_;
  fStack_634 = fVar235 * auVar223._12_4_ + auVar8._12_4_ * fVar240 + fVar237 * auVar150._12_4_;
  local_3b0 = vsubps_avx(_local_520,auVar148);
  auVar8 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar150 = vmovshdup_avx(local_3b0);
  auVar223 = vmovsldup_avx(local_3b0);
  fVar241 = auVar223._0_4_ * fVar192 + auVar150._0_4_ * fVar213 + fVar215 * auVar8._0_4_;
  fVar187 = auVar223._4_4_ * fVar218 + auVar150._4_4_ * fVar236 + fVar238 * auVar8._4_4_;
  local_600._4_4_ = fVar187;
  local_600._0_4_ = fVar241;
  fStack_5f8 = auVar223._8_4_ * fVar212 + auVar150._8_4_ * fVar214 + fVar216 * auVar8._8_4_;
  fStack_5f4 = auVar223._12_4_ * fVar235 + auVar150._12_4_ * fVar237 + fVar240 * auVar8._12_4_;
  auVar199._0_4_ = auVar295._0_4_ * 0.33333334;
  auVar199._4_4_ = auVar295._4_4_ * 0.33333334;
  auVar199._8_4_ = auVar295._8_4_ * 0.33333334;
  auVar199._12_4_ = auVar295._12_4_ * 0.33333334;
  _local_530 = vsubps_avx(_local_500,auVar199);
  local_3c0 = vsubps_avx(_local_530,auVar148);
  auVar8 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar150 = vmovshdup_avx(local_3c0);
  auVar223 = vmovsldup_avx(local_3c0);
  fVar168 = auVar223._0_4_ * fVar192 + auVar150._0_4_ * fVar213 + fVar215 * auVar8._0_4_;
  fVar188 = auVar223._4_4_ * fVar218 + auVar150._4_4_ * fVar236 + fVar238 * auVar8._4_4_;
  local_630._4_4_ = fVar188;
  local_630._0_4_ = fVar168;
  fStack_628 = auVar223._8_4_ * fVar212 + auVar150._8_4_ * fVar214 + fVar216 * auVar8._8_4_;
  fStack_624 = auVar223._12_4_ * fVar235 + auVar150._12_4_ * fVar237 + fVar240 * auVar8._12_4_;
  local_3d0 = vsubps_avx(_local_500,auVar148);
  auVar8 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar150 = vmovshdup_avx(local_3d0);
  auVar223 = vmovsldup_avx(local_3d0);
  auVar318._0_4_ = auVar223._0_4_ * fVar192 + auVar150._0_4_ * fVar213 + auVar8._0_4_ * fVar215;
  auVar318._4_4_ = auVar223._4_4_ * fVar218 + auVar150._4_4_ * fVar236 + auVar8._4_4_ * fVar238;
  auVar318._8_4_ = auVar223._8_4_ * fVar212 + auVar150._8_4_ * fVar214 + auVar8._8_4_ * fVar216;
  auVar318._12_4_ = auVar223._12_4_ * fVar235 + auVar150._12_4_ * fVar237 + auVar8._12_4_ * fVar240;
  local_3e0 = vsubps_avx(_local_4f0,auVar148);
  auVar8 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar150 = vmovshdup_avx(local_3e0);
  auVar223 = vmovsldup_avx(local_3e0);
  auVar200._0_4_ = auVar223._0_4_ * fVar192 + auVar150._0_4_ * fVar213 + auVar8._0_4_ * fVar215;
  auVar200._4_4_ = auVar223._4_4_ * fVar218 + auVar150._4_4_ * fVar236 + auVar8._4_4_ * fVar238;
  auVar200._8_4_ = auVar223._8_4_ * fVar212 + auVar150._8_4_ * fVar214 + auVar8._8_4_ * fVar216;
  auVar200._12_4_ = auVar223._12_4_ * fVar235 + auVar150._12_4_ * fVar237 + auVar8._12_4_ * fVar240;
  local_540._0_4_ = (float)local_4f0._0_4_ + (fVar189 + auVar224._0_4_) * 0.33333334;
  local_540._4_4_ = (float)local_4f0._4_4_ + (fVar190 + auVar224._4_4_) * 0.33333334;
  fStack_538 = fStack_4e8 + (fVar191 + auVar224._8_4_) * 0.33333334;
  fStack_534 = fStack_4e4 + (fVar303 + auVar224._12_4_) * 0.33333334;
  local_3f0 = vsubps_avx(_local_540,auVar148);
  auVar8 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar150 = vmovshdup_avx(local_3f0);
  auVar223 = vmovsldup_avx(local_3f0);
  auVar307._0_4_ = auVar223._0_4_ * fVar192 + auVar150._0_4_ * fVar213 + auVar8._0_4_ * fVar215;
  auVar307._4_4_ = auVar223._4_4_ * fVar218 + auVar150._4_4_ * fVar236 + auVar8._4_4_ * fVar238;
  auVar307._8_4_ = auVar223._8_4_ * fVar212 + auVar150._8_4_ * fVar214 + auVar8._8_4_ * fVar216;
  auVar307._12_4_ = auVar223._12_4_ * fVar235 + auVar150._12_4_ * fVar237 + auVar8._12_4_ * fVar240;
  auVar246._0_4_ = (fVar304 + auVar103._0_4_) * 0.33333334;
  auVar246._4_4_ = (fVar305 + auVar103._4_4_) * 0.33333334;
  auVar246._8_4_ = (fVar306 + auVar103._8_4_) * 0.33333334;
  auVar246._12_4_ = (fVar310 + auVar103._12_4_) * 0.33333334;
  _local_430 = vsubps_avx(_local_510,auVar246);
  local_400 = vsubps_avx(_local_430,auVar148);
  auVar8 = vshufps_avx(local_400,local_400,0xaa);
  auVar150 = vmovshdup_avx(local_400);
  auVar223 = vmovsldup_avx(local_400);
  auVar287._0_4_ = auVar223._0_4_ * fVar192 + auVar150._0_4_ * fVar213 + fVar215 * auVar8._0_4_;
  auVar287._4_4_ = auVar223._4_4_ * fVar218 + auVar150._4_4_ * fVar236 + fVar238 * auVar8._4_4_;
  auVar287._8_4_ = auVar223._8_4_ * fVar212 + auVar150._8_4_ * fVar214 + fVar216 * auVar8._8_4_;
  auVar287._12_4_ = auVar223._12_4_ * fVar235 + auVar150._12_4_ * fVar237 + fVar240 * auVar8._12_4_;
  local_410 = vsubps_avx(_local_510,auVar148);
  auVar148 = vshufps_avx(local_410,local_410,0xaa);
  auVar150 = vmovshdup_avx(local_410);
  auVar223 = vmovsldup_avx(local_410);
  auVar271._0_4_ = fVar192 * auVar223._0_4_ + fVar213 * auVar150._0_4_ + fVar215 * auVar148._0_4_;
  auVar271._4_4_ = fVar218 * auVar223._4_4_ + fVar236 * auVar150._4_4_ + fVar238 * auVar148._4_4_;
  auVar271._8_4_ = fVar212 * auVar223._8_4_ + fVar214 * auVar150._8_4_ + fVar216 * auVar148._8_4_;
  auVar271._12_4_ =
       fVar235 * auVar223._12_4_ + fVar237 * auVar150._12_4_ + fVar240 * auVar148._12_4_;
  auVar8 = vmovlhps_avx(_local_640,auVar200);
  auVar295 = vmovlhps_avx(_local_600,auVar307);
  auVar9 = vmovlhps_avx(_local_630,auVar287);
  _local_4c0 = vmovlhps_avx(auVar318,auVar271);
  auVar150 = vminps_avx(auVar8,auVar295);
  auVar223 = vminps_avx(auVar9,_local_4c0);
  auVar148 = vminps_avx(auVar150,auVar223);
  auVar150 = vmaxps_avx(auVar8,auVar295);
  auVar223 = vmaxps_avx(auVar9,_local_4c0);
  auVar150 = vmaxps_avx(auVar150,auVar223);
  auVar223 = vshufpd_avx(auVar148,auVar148,3);
  auVar148 = vminps_avx(auVar148,auVar223);
  auVar223 = vshufpd_avx(auVar150,auVar150,3);
  auVar223 = vmaxps_avx(auVar150,auVar223);
  auVar225._8_4_ = 0x7fffffff;
  auVar225._0_8_ = 0x7fffffff7fffffff;
  auVar225._12_4_ = 0x7fffffff;
  auVar150 = vandps_avx(auVar148,auVar225);
  auVar223 = vandps_avx(auVar223,auVar225);
  auVar150 = vmaxps_avx(auVar150,auVar223);
  auVar223 = vmovshdup_avx(auVar150);
  auVar150 = vmaxss_avx(auVar223,auVar150);
  fVar192 = auVar150._0_4_ * 9.536743e-07;
  local_4d0 = ZEXT416((uint)fVar192);
  auVar150 = vshufps_avx(local_4d0,ZEXT416((uint)fVar192),0);
  local_1c0._16_16_ = auVar150;
  local_1c0._0_16_ = auVar150;
  auVar76._0_8_ = auVar150._0_8_ ^ 0x8000000080000000;
  auVar76._8_4_ = auVar150._8_4_ ^ 0x80000000;
  auVar76._12_4_ = auVar150._12_4_ ^ 0x80000000;
  local_360._16_16_ = auVar76;
  local_360._0_16_ = auVar76;
  auVar150 = vpshufd_avx(ZEXT416(uVar65),0);
  local_300._16_16_ = auVar150;
  local_300._0_16_ = auVar150;
  auVar150 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar71 * 4 + 6)),0);
  local_320._16_16_ = auVar150;
  local_320._0_16_ = auVar150;
  bVar74 = false;
  uVar73 = 0;
  fVar192 = *(float *)(ray + k * 4 + 0x60);
  _local_370 = vsubps_avx(auVar295,auVar8);
  _local_380 = vsubps_avx(auVar9,auVar295);
  _local_390 = vsubps_avx(_local_4c0,auVar9);
  _local_440 = vsubps_avx(_local_4f0,_local_4e0);
  _local_450 = vsubps_avx(_local_540,_local_520);
  _local_460 = vsubps_avx(_local_430,_local_530);
  _local_470 = vsubps_avx(_local_510,_local_500);
  auVar234 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar322 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_0100dfbc:
  do {
    local_420 = auVar322._0_16_;
    auVar101 = auVar234._0_16_;
    auVar150 = vshufps_avx(auVar101,auVar101,0x50);
    auVar328._8_4_ = 0x3f800000;
    auVar328._0_8_ = 0x3f8000003f800000;
    auVar328._12_4_ = 0x3f800000;
    auVar332._16_4_ = 0x3f800000;
    auVar332._0_16_ = auVar328;
    auVar332._20_4_ = 0x3f800000;
    auVar332._24_4_ = 0x3f800000;
    auVar332._28_4_ = 0x3f800000;
    auVar223 = vsubps_avx(auVar328,auVar150);
    fVar218 = auVar150._0_4_;
    fVar235 = auVar150._4_4_;
    fVar236 = auVar150._8_4_;
    fVar237 = auVar150._12_4_;
    fVar212 = auVar223._0_4_;
    fVar213 = auVar223._4_4_;
    fVar214 = auVar223._8_4_;
    fVar215 = auVar223._12_4_;
    auVar160._0_4_ = auVar200._0_4_ * fVar218 + fVar217 * fVar212;
    auVar160._4_4_ = auVar200._4_4_ * fVar235 + fVar186 * fVar213;
    auVar160._8_4_ = auVar200._0_4_ * fVar236 + fVar217 * fVar214;
    auVar160._12_4_ = auVar200._4_4_ * fVar237 + fVar186 * fVar215;
    auVar134._0_4_ = auVar307._0_4_ * fVar218 + fVar241 * fVar212;
    auVar134._4_4_ = auVar307._4_4_ * fVar235 + fVar187 * fVar213;
    auVar134._8_4_ = auVar307._0_4_ * fVar236 + fVar241 * fVar214;
    auVar134._12_4_ = auVar307._4_4_ * fVar237 + fVar187 * fVar215;
    auVar247._0_4_ = auVar287._0_4_ * fVar218 + fVar168 * fVar212;
    auVar247._4_4_ = auVar287._4_4_ * fVar235 + fVar188 * fVar213;
    auVar247._8_4_ = auVar287._0_4_ * fVar236 + fVar168 * fVar214;
    auVar247._12_4_ = auVar287._4_4_ * fVar237 + fVar188 * fVar215;
    auVar171._0_4_ = auVar271._0_4_ * fVar218 + auVar318._0_4_ * fVar212;
    auVar171._4_4_ = auVar271._4_4_ * fVar235 + auVar318._4_4_ * fVar213;
    auVar171._8_4_ = auVar271._0_4_ * fVar236 + auVar318._0_4_ * fVar214;
    auVar171._12_4_ = auVar271._4_4_ * fVar237 + auVar318._4_4_ * fVar215;
    auVar150 = vmovshdup_avx(local_420);
    auVar223 = vshufps_avx(local_420,local_420,0);
    auVar278._16_16_ = auVar223;
    auVar278._0_16_ = auVar223;
    auVar148 = vshufps_avx(local_420,local_420,0x55);
    auVar94._16_16_ = auVar148;
    auVar94._0_16_ = auVar148;
    auVar90 = vsubps_avx(auVar94,auVar278);
    auVar148 = vshufps_avx(auVar160,auVar160,0);
    auVar117 = vshufps_avx(auVar160,auVar160,0x55);
    auVar106 = vshufps_avx(auVar134,auVar134,0);
    auVar138 = vshufps_avx(auVar134,auVar134,0x55);
    auVar107 = vshufps_avx(auVar247,auVar247,0);
    auVar239 = vshufps_avx(auVar247,auVar247,0x55);
    auVar269 = vshufps_avx(auVar171,auVar171,0);
    auVar75 = vshufps_avx(auVar171,auVar171,0x55);
    auVar150 = ZEXT416((uint)((auVar150._0_4_ - auVar322._0_4_) * 0.04761905));
    auVar150 = vshufps_avx(auVar150,auVar150,0);
    auVar292._0_4_ = auVar223._0_4_ + auVar90._0_4_ * 0.0;
    auVar292._4_4_ = auVar223._4_4_ + auVar90._4_4_ * 0.14285715;
    auVar292._8_4_ = auVar223._8_4_ + auVar90._8_4_ * 0.2857143;
    auVar292._12_4_ = auVar223._12_4_ + auVar90._12_4_ * 0.42857146;
    auVar292._16_4_ = auVar223._0_4_ + auVar90._16_4_ * 0.5714286;
    auVar292._20_4_ = auVar223._4_4_ + auVar90._20_4_ * 0.71428573;
    auVar292._24_4_ = auVar223._8_4_ + auVar90._24_4_ * 0.8571429;
    auVar292._28_4_ = auVar223._12_4_ + auVar90._28_4_;
    auVar19 = vsubps_avx(auVar332,auVar292);
    fVar218 = auVar106._0_4_;
    fVar235 = auVar106._4_4_;
    fVar236 = auVar106._8_4_;
    fVar237 = auVar106._12_4_;
    fVar335 = auVar19._0_4_;
    fVar280 = auVar19._4_4_;
    fVar281 = auVar19._8_4_;
    fVar282 = auVar19._12_4_;
    fVar283 = auVar19._16_4_;
    fVar284 = auVar19._20_4_;
    fVar285 = auVar19._24_4_;
    fVar312 = auVar138._0_4_;
    fVar323 = auVar138._4_4_;
    fVar325 = auVar138._8_4_;
    fVar333 = auVar138._12_4_;
    fVar326 = auVar117._12_4_ + 1.0;
    fVar305 = auVar107._0_4_;
    fVar306 = auVar107._4_4_;
    fVar310 = auVar107._8_4_;
    fVar311 = auVar107._12_4_;
    fVar238 = fVar305 * auVar292._0_4_ + fVar335 * fVar218;
    fVar216 = fVar306 * auVar292._4_4_ + fVar280 * fVar235;
    fVar240 = fVar310 * auVar292._8_4_ + fVar281 * fVar236;
    fVar189 = fVar311 * auVar292._12_4_ + fVar282 * fVar237;
    fVar190 = fVar305 * auVar292._16_4_ + fVar283 * fVar218;
    fVar191 = fVar306 * auVar292._20_4_ + fVar284 * fVar235;
    fVar303 = fVar310 * auVar292._24_4_ + fVar285 * fVar236;
    fVar212 = auVar239._0_4_;
    fVar213 = auVar239._4_4_;
    fVar214 = auVar239._8_4_;
    fVar215 = auVar239._12_4_;
    fVar317 = fVar312 * fVar335 + auVar292._0_4_ * fVar212;
    fVar324 = fVar323 * fVar280 + auVar292._4_4_ * fVar213;
    fVar327 = fVar325 * fVar281 + auVar292._8_4_ * fVar214;
    fVar334 = fVar333 * fVar282 + auVar292._12_4_ * fVar215;
    fVar313 = fVar312 * fVar283 + auVar292._16_4_ * fVar212;
    fVar314 = fVar323 * fVar284 + auVar292._20_4_ * fVar213;
    fVar315 = fVar325 * fVar285 + auVar292._24_4_ * fVar214;
    fVar316 = fVar333 + fVar237;
    auVar223 = vshufps_avx(auVar160,auVar160,0xaa);
    auVar106 = vshufps_avx(auVar160,auVar160,0xff);
    fVar304 = fVar311 + 0.0;
    auVar138 = vshufps_avx(auVar134,auVar134,0xaa);
    auVar107 = vshufps_avx(auVar134,auVar134,0xff);
    auVar184._0_4_ =
         fVar335 * (auVar292._0_4_ * fVar218 + fVar335 * auVar148._0_4_) + auVar292._0_4_ * fVar238;
    auVar184._4_4_ =
         fVar280 * (auVar292._4_4_ * fVar235 + fVar280 * auVar148._4_4_) + auVar292._4_4_ * fVar216;
    auVar184._8_4_ =
         fVar281 * (auVar292._8_4_ * fVar236 + fVar281 * auVar148._8_4_) + auVar292._8_4_ * fVar240;
    auVar184._12_4_ =
         fVar282 * (auVar292._12_4_ * fVar237 + fVar282 * auVar148._12_4_) +
         auVar292._12_4_ * fVar189;
    auVar184._16_4_ =
         fVar283 * (auVar292._16_4_ * fVar218 + fVar283 * auVar148._0_4_) +
         auVar292._16_4_ * fVar190;
    auVar184._20_4_ =
         fVar284 * (auVar292._20_4_ * fVar235 + fVar284 * auVar148._4_4_) +
         auVar292._20_4_ * fVar191;
    auVar184._24_4_ =
         fVar285 * (auVar292._24_4_ * fVar236 + fVar285 * auVar148._8_4_) +
         auVar292._24_4_ * fVar303;
    auVar184._28_4_ = auVar148._12_4_ + 1.0 + fVar215;
    auVar210._0_4_ =
         fVar335 * (fVar312 * auVar292._0_4_ + auVar117._0_4_ * fVar335) + auVar292._0_4_ * fVar317;
    auVar210._4_4_ =
         fVar280 * (fVar323 * auVar292._4_4_ + auVar117._4_4_ * fVar280) + auVar292._4_4_ * fVar324;
    auVar210._8_4_ =
         fVar281 * (fVar325 * auVar292._8_4_ + auVar117._8_4_ * fVar281) + auVar292._8_4_ * fVar327;
    auVar210._12_4_ =
         fVar282 * (fVar333 * auVar292._12_4_ + auVar117._12_4_ * fVar282) +
         auVar292._12_4_ * fVar334;
    auVar210._16_4_ =
         fVar283 * (fVar312 * auVar292._16_4_ + auVar117._0_4_ * fVar283) +
         auVar292._16_4_ * fVar313;
    auVar210._20_4_ =
         fVar284 * (fVar323 * auVar292._20_4_ + auVar117._4_4_ * fVar284) +
         auVar292._20_4_ * fVar314;
    auVar210._24_4_ =
         fVar285 * (fVar325 * auVar292._24_4_ + auVar117._8_4_ * fVar285) +
         auVar292._24_4_ * fVar315;
    auVar210._28_4_ = auVar75._12_4_ + fVar215;
    auVar95._0_4_ =
         fVar335 * fVar238 + auVar292._0_4_ * (fVar305 * fVar335 + auVar269._0_4_ * auVar292._0_4_);
    auVar95._4_4_ =
         fVar280 * fVar216 + auVar292._4_4_ * (fVar306 * fVar280 + auVar269._4_4_ * auVar292._4_4_);
    auVar95._8_4_ =
         fVar281 * fVar240 + auVar292._8_4_ * (fVar310 * fVar281 + auVar269._8_4_ * auVar292._8_4_);
    auVar95._12_4_ =
         fVar282 * fVar189 +
         auVar292._12_4_ * (fVar311 * fVar282 + auVar269._12_4_ * auVar292._12_4_);
    auVar95._16_4_ =
         fVar283 * fVar190 +
         auVar292._16_4_ * (fVar305 * fVar283 + auVar269._0_4_ * auVar292._16_4_);
    auVar95._20_4_ =
         fVar284 * fVar191 +
         auVar292._20_4_ * (fVar306 * fVar284 + auVar269._4_4_ * auVar292._20_4_);
    auVar95._24_4_ =
         fVar285 * fVar303 +
         auVar292._24_4_ * (fVar310 * fVar285 + auVar269._8_4_ * auVar292._24_4_);
    auVar95._28_4_ = fVar237 + 1.0 + fVar304;
    auVar302._0_4_ =
         fVar335 * fVar317 + auVar292._0_4_ * (auVar75._0_4_ * auVar292._0_4_ + fVar335 * fVar212);
    auVar302._4_4_ =
         fVar280 * fVar324 + auVar292._4_4_ * (auVar75._4_4_ * auVar292._4_4_ + fVar280 * fVar213);
    auVar302._8_4_ =
         fVar281 * fVar327 + auVar292._8_4_ * (auVar75._8_4_ * auVar292._8_4_ + fVar281 * fVar214);
    auVar302._12_4_ =
         fVar282 * fVar334 +
         auVar292._12_4_ * (auVar75._12_4_ * auVar292._12_4_ + fVar282 * fVar215);
    auVar302._16_4_ =
         fVar283 * fVar313 + auVar292._16_4_ * (auVar75._0_4_ * auVar292._16_4_ + fVar283 * fVar212)
    ;
    auVar302._20_4_ =
         fVar284 * fVar314 + auVar292._20_4_ * (auVar75._4_4_ * auVar292._20_4_ + fVar284 * fVar213)
    ;
    auVar302._24_4_ =
         fVar285 * fVar315 + auVar292._24_4_ * (auVar75._8_4_ * auVar292._24_4_ + fVar285 * fVar214)
    ;
    auVar302._28_4_ = fVar304 + fVar215 + 0.0;
    local_200._0_4_ = fVar335 * auVar184._0_4_ + auVar292._0_4_ * auVar95._0_4_;
    local_200._4_4_ = fVar280 * auVar184._4_4_ + auVar292._4_4_ * auVar95._4_4_;
    local_200._8_4_ = fVar281 * auVar184._8_4_ + auVar292._8_4_ * auVar95._8_4_;
    local_200._12_4_ = fVar282 * auVar184._12_4_ + auVar292._12_4_ * auVar95._12_4_;
    local_200._16_4_ = fVar283 * auVar184._16_4_ + auVar292._16_4_ * auVar95._16_4_;
    local_200._20_4_ = fVar284 * auVar184._20_4_ + auVar292._20_4_ * auVar95._20_4_;
    local_200._24_4_ = fVar285 * auVar184._24_4_ + auVar292._24_4_ * auVar95._24_4_;
    local_200._28_4_ = fVar316 + fVar215 + 0.0;
    auVar167._0_4_ = fVar335 * auVar210._0_4_ + auVar292._0_4_ * auVar302._0_4_;
    auVar167._4_4_ = fVar280 * auVar210._4_4_ + auVar292._4_4_ * auVar302._4_4_;
    auVar167._8_4_ = fVar281 * auVar210._8_4_ + auVar292._8_4_ * auVar302._8_4_;
    auVar167._12_4_ = fVar282 * auVar210._12_4_ + auVar292._12_4_ * auVar302._12_4_;
    auVar167._16_4_ = fVar283 * auVar210._16_4_ + auVar292._16_4_ * auVar302._16_4_;
    auVar167._20_4_ = fVar284 * auVar210._20_4_ + auVar292._20_4_ * auVar302._20_4_;
    auVar167._24_4_ = fVar285 * auVar210._24_4_ + auVar292._24_4_ * auVar302._24_4_;
    auVar167._28_4_ = fVar316 + fVar304;
    auVar20 = vsubps_avx(auVar95,auVar184);
    auVar90 = vsubps_avx(auVar302,auVar210);
    local_5e0 = auVar150._0_4_;
    fStack_5dc = auVar150._4_4_;
    fStack_5d8 = auVar150._8_4_;
    fStack_5d4 = auVar150._12_4_;
    local_240 = local_5e0 * auVar20._0_4_ * 3.0;
    fStack_23c = fStack_5dc * auVar20._4_4_ * 3.0;
    auVar27._4_4_ = fStack_23c;
    auVar27._0_4_ = local_240;
    fStack_238 = fStack_5d8 * auVar20._8_4_ * 3.0;
    auVar27._8_4_ = fStack_238;
    fStack_234 = fStack_5d4 * auVar20._12_4_ * 3.0;
    auVar27._12_4_ = fStack_234;
    fStack_230 = local_5e0 * auVar20._16_4_ * 3.0;
    auVar27._16_4_ = fStack_230;
    fStack_22c = fStack_5dc * auVar20._20_4_ * 3.0;
    auVar27._20_4_ = fStack_22c;
    fStack_228 = fStack_5d8 * auVar20._24_4_ * 3.0;
    auVar27._24_4_ = fStack_228;
    auVar27._28_4_ = auVar20._28_4_;
    local_260 = local_5e0 * auVar90._0_4_ * 3.0;
    fStack_25c = fStack_5dc * auVar90._4_4_ * 3.0;
    auVar28._4_4_ = fStack_25c;
    auVar28._0_4_ = local_260;
    fStack_258 = fStack_5d8 * auVar90._8_4_ * 3.0;
    auVar28._8_4_ = fStack_258;
    fStack_254 = fStack_5d4 * auVar90._12_4_ * 3.0;
    auVar28._12_4_ = fStack_254;
    fStack_250 = local_5e0 * auVar90._16_4_ * 3.0;
    auVar28._16_4_ = fStack_250;
    fStack_24c = fStack_5dc * auVar90._20_4_ * 3.0;
    auVar28._20_4_ = fStack_24c;
    fStack_248 = fStack_5d8 * auVar90._24_4_ * 3.0;
    auVar28._24_4_ = fStack_248;
    auVar28._28_4_ = fVar316;
    auVar17 = vsubps_avx(local_200,auVar27);
    auVar90 = vperm2f128_avx(auVar17,auVar17,1);
    auVar90 = vshufps_avx(auVar90,auVar17,0x30);
    auVar90 = vshufps_avx(auVar17,auVar90,0x29);
    auVar18 = vsubps_avx(auVar167,auVar28);
    auVar17 = vperm2f128_avx(auVar18,auVar18,1);
    auVar17 = vshufps_avx(auVar17,auVar18,0x30);
    auVar18 = vshufps_avx(auVar18,auVar17,0x29);
    fVar314 = auVar138._0_4_;
    fVar315 = auVar138._4_4_;
    fVar337 = auVar138._8_4_;
    fVar237 = auVar223._12_4_;
    fVar306 = auVar107._0_4_;
    fVar311 = auVar107._4_4_;
    fVar317 = auVar107._8_4_;
    fVar324 = auVar107._12_4_;
    auVar150 = vshufps_avx(auVar247,auVar247,0xaa);
    fVar218 = auVar150._0_4_;
    fVar235 = auVar150._4_4_;
    fVar236 = auVar150._8_4_;
    fVar215 = auVar150._12_4_;
    fVar240 = auVar292._0_4_ * fVar218 + fVar314 * fVar335;
    fVar189 = auVar292._4_4_ * fVar235 + fVar315 * fVar280;
    fVar190 = auVar292._8_4_ * fVar236 + fVar337 * fVar281;
    fVar191 = auVar292._12_4_ * fVar215 + auVar138._12_4_ * fVar282;
    fVar303 = auVar292._16_4_ * fVar218 + fVar314 * fVar283;
    fVar304 = auVar292._20_4_ * fVar235 + fVar315 * fVar284;
    fVar305 = auVar292._24_4_ * fVar236 + fVar337 * fVar285;
    auVar150 = vshufps_avx(auVar247,auVar247,0xff);
    fVar212 = auVar150._0_4_;
    fVar213 = auVar150._4_4_;
    fVar214 = auVar150._8_4_;
    fVar238 = auVar150._12_4_;
    fVar310 = auVar292._0_4_ * fVar212 + fVar306 * fVar335;
    fVar312 = auVar292._4_4_ * fVar213 + fVar311 * fVar280;
    fVar323 = auVar292._8_4_ * fVar214 + fVar317 * fVar281;
    fVar325 = auVar292._12_4_ * fVar238 + fVar324 * fVar282;
    fVar327 = auVar292._16_4_ * fVar212 + fVar306 * fVar283;
    fVar333 = auVar292._20_4_ * fVar213 + fVar311 * fVar284;
    fVar334 = auVar292._24_4_ * fVar214 + fVar317 * fVar285;
    auVar150 = vshufps_avx(auVar171,auVar171,0xaa);
    fVar313 = auVar150._12_4_ + fVar215;
    auVar148 = vshufps_avx(auVar171,auVar171,0xff);
    fVar216 = auVar148._12_4_;
    auVar96._0_4_ =
         fVar335 * (fVar314 * auVar292._0_4_ + fVar335 * auVar223._0_4_) + auVar292._0_4_ * fVar240;
    auVar96._4_4_ =
         fVar280 * (fVar315 * auVar292._4_4_ + fVar280 * auVar223._4_4_) + auVar292._4_4_ * fVar189;
    auVar96._8_4_ =
         fVar281 * (fVar337 * auVar292._8_4_ + fVar281 * auVar223._8_4_) + auVar292._8_4_ * fVar190;
    auVar96._12_4_ =
         fVar282 * (auVar138._12_4_ * auVar292._12_4_ + fVar282 * fVar237) +
         auVar292._12_4_ * fVar191;
    auVar96._16_4_ =
         fVar283 * (fVar314 * auVar292._16_4_ + fVar283 * auVar223._0_4_) +
         auVar292._16_4_ * fVar303;
    auVar96._20_4_ =
         fVar284 * (fVar315 * auVar292._20_4_ + fVar284 * auVar223._4_4_) +
         auVar292._20_4_ * fVar304;
    auVar96._24_4_ =
         fVar285 * (fVar337 * auVar292._24_4_ + fVar285 * auVar223._8_4_) +
         auVar292._24_4_ * fVar305;
    auVar96._28_4_ = auVar18._28_4_ + fVar237 + fVar216;
    auVar126._0_4_ =
         fVar335 * (fVar306 * auVar292._0_4_ + auVar106._0_4_ * fVar335) + auVar292._0_4_ * fVar310;
    auVar126._4_4_ =
         fVar280 * (fVar311 * auVar292._4_4_ + auVar106._4_4_ * fVar280) + auVar292._4_4_ * fVar312;
    auVar126._8_4_ =
         fVar281 * (fVar317 * auVar292._8_4_ + auVar106._8_4_ * fVar281) + auVar292._8_4_ * fVar323;
    auVar126._12_4_ =
         fVar282 * (fVar324 * auVar292._12_4_ + auVar106._12_4_ * fVar282) +
         auVar292._12_4_ * fVar325;
    auVar126._16_4_ =
         fVar283 * (fVar306 * auVar292._16_4_ + auVar106._0_4_ * fVar283) +
         auVar292._16_4_ * fVar327;
    auVar126._20_4_ =
         fVar284 * (fVar311 * auVar292._20_4_ + auVar106._4_4_ * fVar284) +
         auVar292._20_4_ * fVar333;
    auVar126._24_4_ =
         fVar285 * (fVar317 * auVar292._24_4_ + auVar106._8_4_ * fVar285) +
         auVar292._24_4_ * fVar334;
    auVar126._28_4_ = fVar237 + auVar17._28_4_ + fVar216;
    auVar17 = vperm2f128_avx(local_200,local_200,1);
    auVar17 = vshufps_avx(auVar17,local_200,0x30);
    _local_560 = vshufps_avx(local_200,auVar17,0x29);
    auVar211._0_4_ =
         auVar292._0_4_ * (auVar150._0_4_ * auVar292._0_4_ + fVar335 * fVar218) + fVar335 * fVar240;
    auVar211._4_4_ =
         auVar292._4_4_ * (auVar150._4_4_ * auVar292._4_4_ + fVar280 * fVar235) + fVar280 * fVar189;
    auVar211._8_4_ =
         auVar292._8_4_ * (auVar150._8_4_ * auVar292._8_4_ + fVar281 * fVar236) + fVar281 * fVar190;
    auVar211._12_4_ =
         auVar292._12_4_ * (auVar150._12_4_ * auVar292._12_4_ + fVar282 * fVar215) +
         fVar282 * fVar191;
    auVar211._16_4_ =
         auVar292._16_4_ * (auVar150._0_4_ * auVar292._16_4_ + fVar283 * fVar218) +
         fVar283 * fVar303;
    auVar211._20_4_ =
         auVar292._20_4_ * (auVar150._4_4_ * auVar292._20_4_ + fVar284 * fVar235) +
         fVar284 * fVar304;
    auVar211._24_4_ =
         auVar292._24_4_ * (auVar150._8_4_ * auVar292._24_4_ + fVar285 * fVar236) +
         fVar285 * fVar305;
    auVar211._28_4_ = fVar313 + fVar326 + auVar210._28_4_;
    auVar264._0_4_ =
         fVar335 * fVar310 + auVar292._0_4_ * (auVar292._0_4_ * auVar148._0_4_ + fVar335 * fVar212);
    auVar264._4_4_ =
         fVar280 * fVar312 + auVar292._4_4_ * (auVar292._4_4_ * auVar148._4_4_ + fVar280 * fVar213);
    auVar264._8_4_ =
         fVar281 * fVar323 + auVar292._8_4_ * (auVar292._8_4_ * auVar148._8_4_ + fVar281 * fVar214);
    auVar264._12_4_ =
         fVar282 * fVar325 + auVar292._12_4_ * (auVar292._12_4_ * fVar216 + fVar282 * fVar238);
    auVar264._16_4_ =
         fVar283 * fVar327 +
         auVar292._16_4_ * (auVar292._16_4_ * auVar148._0_4_ + fVar283 * fVar212);
    auVar264._20_4_ =
         fVar284 * fVar333 +
         auVar292._20_4_ * (auVar292._20_4_ * auVar148._4_4_ + fVar284 * fVar213);
    auVar264._24_4_ =
         fVar285 * fVar334 +
         auVar292._24_4_ * (auVar292._24_4_ * auVar148._8_4_ + fVar285 * fVar214);
    auVar264._28_4_ = fVar326 + fVar324 + fVar216 + fVar238;
    auVar255._0_4_ = fVar335 * auVar96._0_4_ + auVar292._0_4_ * auVar211._0_4_;
    auVar255._4_4_ = fVar280 * auVar96._4_4_ + auVar292._4_4_ * auVar211._4_4_;
    auVar255._8_4_ = fVar281 * auVar96._8_4_ + auVar292._8_4_ * auVar211._8_4_;
    auVar255._12_4_ = fVar282 * auVar96._12_4_ + auVar292._12_4_ * auVar211._12_4_;
    auVar255._16_4_ = fVar283 * auVar96._16_4_ + auVar292._16_4_ * auVar211._16_4_;
    auVar255._20_4_ = fVar284 * auVar96._20_4_ + auVar292._20_4_ * auVar211._20_4_;
    auVar255._24_4_ = fVar285 * auVar96._24_4_ + auVar292._24_4_ * auVar211._24_4_;
    auVar255._28_4_ = fVar313 + fVar216 + fVar238;
    auVar279._0_4_ = fVar335 * auVar126._0_4_ + auVar292._0_4_ * auVar264._0_4_;
    auVar279._4_4_ = fVar280 * auVar126._4_4_ + auVar292._4_4_ * auVar264._4_4_;
    auVar279._8_4_ = fVar281 * auVar126._8_4_ + auVar292._8_4_ * auVar264._8_4_;
    auVar279._12_4_ = fVar282 * auVar126._12_4_ + auVar292._12_4_ * auVar264._12_4_;
    auVar279._16_4_ = fVar283 * auVar126._16_4_ + auVar292._16_4_ * auVar264._16_4_;
    auVar279._20_4_ = fVar284 * auVar126._20_4_ + auVar292._20_4_ * auVar264._20_4_;
    auVar279._24_4_ = fVar285 * auVar126._24_4_ + auVar292._24_4_ * auVar264._24_4_;
    auVar279._28_4_ = auVar19._28_4_ + auVar292._28_4_;
    auVar23 = vsubps_avx(auVar211,auVar96);
    auVar17 = vsubps_avx(auVar264,auVar126);
    local_280 = local_5e0 * auVar23._0_4_ * 3.0;
    fStack_27c = fStack_5dc * auVar23._4_4_ * 3.0;
    auVar29._4_4_ = fStack_27c;
    auVar29._0_4_ = local_280;
    fStack_278 = fStack_5d8 * auVar23._8_4_ * 3.0;
    auVar29._8_4_ = fStack_278;
    fStack_274 = fStack_5d4 * auVar23._12_4_ * 3.0;
    auVar29._12_4_ = fStack_274;
    fStack_270 = local_5e0 * auVar23._16_4_ * 3.0;
    auVar29._16_4_ = fStack_270;
    fStack_26c = fStack_5dc * auVar23._20_4_ * 3.0;
    auVar29._20_4_ = fStack_26c;
    fStack_268 = fStack_5d8 * auVar23._24_4_ * 3.0;
    auVar29._24_4_ = fStack_268;
    auVar29._28_4_ = auVar23._28_4_;
    local_2a0 = local_5e0 * auVar17._0_4_ * 3.0;
    fStack_29c = fStack_5dc * auVar17._4_4_ * 3.0;
    auVar30._4_4_ = fStack_29c;
    auVar30._0_4_ = local_2a0;
    fStack_298 = fStack_5d8 * auVar17._8_4_ * 3.0;
    auVar30._8_4_ = fStack_298;
    fStack_294 = fStack_5d4 * auVar17._12_4_ * 3.0;
    auVar30._12_4_ = fStack_294;
    fStack_290 = local_5e0 * auVar17._16_4_ * 3.0;
    auVar30._16_4_ = fStack_290;
    fStack_28c = fStack_5dc * auVar17._20_4_ * 3.0;
    auVar30._20_4_ = fStack_28c;
    fStack_288 = fStack_5d8 * auVar17._24_4_ * 3.0;
    auVar30._24_4_ = fStack_288;
    auVar30._28_4_ = auVar211._28_4_;
    auVar17 = vperm2f128_avx(auVar255,auVar255,1);
    auVar17 = vshufps_avx(auVar17,auVar255,0x30);
    auVar21 = vshufps_avx(auVar255,auVar17,0x29);
    auVar19 = vsubps_avx(auVar255,auVar29);
    auVar17 = vperm2f128_avx(auVar19,auVar19,1);
    auVar17 = vshufps_avx(auVar17,auVar19,0x30);
    auVar17 = vshufps_avx(auVar19,auVar17,0x29);
    auVar22 = vsubps_avx(auVar279,auVar30);
    auVar19 = vperm2f128_avx(auVar22,auVar22,1);
    auVar19 = vshufps_avx(auVar19,auVar22,0x30);
    auVar22 = vshufps_avx(auVar22,auVar19,0x29);
    auVar24 = vsubps_avx(auVar255,local_200);
    auVar25 = vsubps_avx(auVar21,_local_560);
    fVar218 = auVar25._0_4_ + auVar24._0_4_;
    fVar212 = auVar25._4_4_ + auVar24._4_4_;
    fVar235 = auVar25._8_4_ + auVar24._8_4_;
    fVar213 = auVar25._12_4_ + auVar24._12_4_;
    fVar236 = auVar25._16_4_ + auVar24._16_4_;
    fVar214 = auVar25._20_4_ + auVar24._20_4_;
    fVar237 = auVar25._24_4_ + auVar24._24_4_;
    auVar19 = vperm2f128_avx(auVar167,auVar167,1);
    auVar19 = vshufps_avx(auVar19,auVar167,0x30);
    local_220 = vshufps_avx(auVar167,auVar19,0x29);
    auVar19 = vperm2f128_avx(auVar279,auVar279,1);
    auVar19 = vshufps_avx(auVar19,auVar279,0x30);
    local_1e0 = vshufps_avx(auVar279,auVar19,0x29);
    auVar19 = vsubps_avx(auVar279,auVar167);
    auVar26 = vsubps_avx(local_1e0,local_220);
    fVar215 = auVar26._0_4_ + auVar19._0_4_;
    fVar238 = auVar26._4_4_ + auVar19._4_4_;
    fVar216 = auVar26._8_4_ + auVar19._8_4_;
    fVar240 = auVar26._12_4_ + auVar19._12_4_;
    fVar189 = auVar26._16_4_ + auVar19._16_4_;
    fVar190 = auVar26._20_4_ + auVar19._20_4_;
    fVar191 = auVar26._24_4_ + auVar19._24_4_;
    auVar31._4_4_ = fVar212 * auVar167._4_4_;
    auVar31._0_4_ = fVar218 * auVar167._0_4_;
    auVar31._8_4_ = fVar235 * auVar167._8_4_;
    auVar31._12_4_ = fVar213 * auVar167._12_4_;
    auVar31._16_4_ = fVar236 * auVar167._16_4_;
    auVar31._20_4_ = fVar214 * auVar167._20_4_;
    auVar31._24_4_ = fVar237 * auVar167._24_4_;
    auVar31._28_4_ = auVar19._28_4_;
    auVar32._4_4_ = fVar238 * local_200._4_4_;
    auVar32._0_4_ = fVar215 * local_200._0_4_;
    auVar32._8_4_ = fVar216 * local_200._8_4_;
    auVar32._12_4_ = fVar240 * local_200._12_4_;
    auVar32._16_4_ = fVar189 * local_200._16_4_;
    auVar32._20_4_ = fVar190 * local_200._20_4_;
    auVar32._24_4_ = fVar191 * local_200._24_4_;
    auVar32._28_4_ = fVar313;
    auVar91 = vsubps_avx(auVar31,auVar32);
    local_240 = local_200._0_4_ + local_240;
    fStack_23c = local_200._4_4_ + fStack_23c;
    fStack_238 = local_200._8_4_ + fStack_238;
    fStack_234 = local_200._12_4_ + fStack_234;
    fStack_230 = local_200._16_4_ + fStack_230;
    fStack_22c = local_200._20_4_ + fStack_22c;
    fStack_228 = local_200._24_4_ + fStack_228;
    fStack_224 = local_200._28_4_ + auVar20._28_4_;
    local_260 = local_260 + auVar167._0_4_;
    fStack_25c = fStack_25c + auVar167._4_4_;
    fStack_258 = fStack_258 + auVar167._8_4_;
    fStack_254 = fStack_254 + auVar167._12_4_;
    fStack_250 = fStack_250 + auVar167._16_4_;
    fStack_24c = fStack_24c + auVar167._20_4_;
    fStack_248 = fStack_248 + auVar167._24_4_;
    fStack_244 = fVar316 + auVar167._28_4_;
    auVar33._4_4_ = fVar212 * fStack_25c;
    auVar33._0_4_ = fVar218 * local_260;
    auVar33._8_4_ = fVar235 * fStack_258;
    auVar33._12_4_ = fVar213 * fStack_254;
    auVar33._16_4_ = fVar236 * fStack_250;
    auVar33._20_4_ = fVar214 * fStack_24c;
    auVar33._24_4_ = fVar237 * fStack_248;
    auVar33._28_4_ = fVar316;
    auVar34._4_4_ = fVar238 * fStack_23c;
    auVar34._0_4_ = fVar215 * local_240;
    auVar34._8_4_ = fVar216 * fStack_238;
    auVar34._12_4_ = fVar240 * fStack_234;
    auVar34._16_4_ = fVar189 * fStack_230;
    auVar34._20_4_ = fVar190 * fStack_22c;
    auVar34._24_4_ = fVar191 * fStack_228;
    auVar34._28_4_ = fVar316 + auVar167._28_4_;
    auVar20 = vsubps_avx(auVar33,auVar34);
    local_600._0_4_ = auVar18._0_4_;
    local_600._4_4_ = auVar18._4_4_;
    fStack_5f8 = auVar18._8_4_;
    fStack_5f4 = auVar18._12_4_;
    fStack_5f0 = auVar18._16_4_;
    fStack_5ec = auVar18._20_4_;
    fStack_5e8 = auVar18._24_4_;
    auVar35._4_4_ = fVar212 * (float)local_600._4_4_;
    auVar35._0_4_ = fVar218 * (float)local_600._0_4_;
    auVar35._8_4_ = fVar235 * fStack_5f8;
    auVar35._12_4_ = fVar213 * fStack_5f4;
    auVar35._16_4_ = fVar236 * fStack_5f0;
    auVar35._20_4_ = fVar214 * fStack_5ec;
    auVar35._24_4_ = fVar237 * fStack_5e8;
    auVar35._28_4_ = fVar316;
    local_6a0._0_4_ = auVar90._0_4_;
    local_6a0._4_4_ = auVar90._4_4_;
    fStack_698 = auVar90._8_4_;
    fStack_694 = auVar90._12_4_;
    fStack_690 = auVar90._16_4_;
    fStack_68c = auVar90._20_4_;
    fStack_688 = auVar90._24_4_;
    auVar36._4_4_ = fVar238 * (float)local_6a0._4_4_;
    auVar36._0_4_ = fVar215 * (float)local_6a0._0_4_;
    auVar36._8_4_ = fVar216 * fStack_698;
    auVar36._12_4_ = fVar240 * fStack_694;
    auVar36._16_4_ = fVar189 * fStack_690;
    auVar36._20_4_ = fVar190 * fStack_68c;
    auVar36._24_4_ = fVar191 * fStack_688;
    auVar36._28_4_ = local_200._28_4_;
    auVar92 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = local_220._4_4_ * fVar212;
    auVar37._0_4_ = local_220._0_4_ * fVar218;
    auVar37._8_4_ = local_220._8_4_ * fVar235;
    auVar37._12_4_ = local_220._12_4_ * fVar213;
    auVar37._16_4_ = local_220._16_4_ * fVar236;
    auVar37._20_4_ = local_220._20_4_ * fVar214;
    auVar37._24_4_ = local_220._24_4_ * fVar237;
    auVar37._28_4_ = fVar316;
    auVar38._4_4_ = local_560._4_4_ * fVar238;
    auVar38._0_4_ = local_560._0_4_ * fVar215;
    auVar38._8_4_ = local_560._8_4_ * fVar216;
    auVar38._12_4_ = local_560._12_4_ * fVar240;
    auVar38._16_4_ = local_560._16_4_ * fVar189;
    auVar38._20_4_ = local_560._20_4_ * fVar190;
    auVar38._24_4_ = local_560._24_4_ * fVar191;
    auVar38._28_4_ = local_220._28_4_;
    local_5e0 = auVar17._0_4_;
    fStack_5dc = auVar17._4_4_;
    fStack_5d8 = auVar17._8_4_;
    fStack_5d4 = auVar17._12_4_;
    fStack_5d0 = auVar17._16_4_;
    fStack_5cc = auVar17._20_4_;
    fStack_5c8 = auVar17._24_4_;
    auVar122 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = auVar279._4_4_ * fVar212;
    auVar39._0_4_ = auVar279._0_4_ * fVar218;
    auVar39._8_4_ = auVar279._8_4_ * fVar235;
    auVar39._12_4_ = auVar279._12_4_ * fVar213;
    auVar39._16_4_ = auVar279._16_4_ * fVar236;
    auVar39._20_4_ = auVar279._20_4_ * fVar214;
    auVar39._24_4_ = auVar279._24_4_ * fVar237;
    auVar39._28_4_ = fVar316;
    auVar40._4_4_ = fVar238 * auVar255._4_4_;
    auVar40._0_4_ = fVar215 * auVar255._0_4_;
    auVar40._8_4_ = fVar216 * auVar255._8_4_;
    auVar40._12_4_ = fVar240 * auVar255._12_4_;
    auVar40._16_4_ = fVar189 * auVar255._16_4_;
    auVar40._20_4_ = fVar190 * auVar255._20_4_;
    auVar40._24_4_ = fVar191 * auVar255._24_4_;
    auVar40._28_4_ = fStack_224;
    auVar123 = vsubps_avx(auVar39,auVar40);
    local_280 = auVar255._0_4_ + local_280;
    fStack_27c = auVar255._4_4_ + fStack_27c;
    fStack_278 = auVar255._8_4_ + fStack_278;
    fStack_274 = auVar255._12_4_ + fStack_274;
    fStack_270 = auVar255._16_4_ + fStack_270;
    fStack_26c = auVar255._20_4_ + fStack_26c;
    fStack_268 = auVar255._24_4_ + fStack_268;
    fStack_264 = auVar255._28_4_ + auVar23._28_4_;
    local_2a0 = auVar279._0_4_ + local_2a0;
    fStack_29c = auVar279._4_4_ + fStack_29c;
    fStack_298 = auVar279._8_4_ + fStack_298;
    fStack_294 = auVar279._12_4_ + fStack_294;
    fStack_290 = auVar279._16_4_ + fStack_290;
    fStack_28c = auVar279._20_4_ + fStack_28c;
    fStack_288 = auVar279._24_4_ + fStack_288;
    fStack_284 = auVar279._28_4_ + auVar211._28_4_;
    auVar41._4_4_ = fVar212 * fStack_29c;
    auVar41._0_4_ = fVar218 * local_2a0;
    auVar41._8_4_ = fVar235 * fStack_298;
    auVar41._12_4_ = fVar213 * fStack_294;
    auVar41._16_4_ = fVar236 * fStack_290;
    auVar41._20_4_ = fVar214 * fStack_28c;
    auVar41._24_4_ = fVar237 * fStack_288;
    auVar41._28_4_ = auVar279._28_4_ + auVar211._28_4_;
    auVar42._4_4_ = fStack_27c * fVar238;
    auVar42._0_4_ = local_280 * fVar215;
    auVar42._8_4_ = fStack_278 * fVar216;
    auVar42._12_4_ = fStack_274 * fVar240;
    auVar42._16_4_ = fStack_270 * fVar189;
    auVar42._20_4_ = fStack_26c * fVar190;
    auVar42._24_4_ = fStack_268 * fVar191;
    auVar42._28_4_ = fStack_264;
    auVar23 = vsubps_avx(auVar41,auVar42);
    auVar43._4_4_ = fVar212 * auVar22._4_4_;
    auVar43._0_4_ = fVar218 * auVar22._0_4_;
    auVar43._8_4_ = fVar235 * auVar22._8_4_;
    auVar43._12_4_ = fVar213 * auVar22._12_4_;
    auVar43._16_4_ = fVar236 * auVar22._16_4_;
    auVar43._20_4_ = fVar214 * auVar22._20_4_;
    auVar43._24_4_ = fVar237 * auVar22._24_4_;
    auVar43._28_4_ = fStack_264;
    auVar44._4_4_ = fVar238 * fStack_5dc;
    auVar44._0_4_ = fVar215 * local_5e0;
    auVar44._8_4_ = fVar216 * fStack_5d8;
    auVar44._12_4_ = fVar240 * fStack_5d4;
    auVar44._16_4_ = fVar189 * fStack_5d0;
    auVar44._20_4_ = fVar190 * fStack_5cc;
    auVar44._24_4_ = fVar191 * fStack_5c8;
    auVar44._28_4_ = auVar22._28_4_;
    auVar124 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = fVar212 * local_1e0._4_4_;
    auVar45._0_4_ = fVar218 * local_1e0._0_4_;
    auVar45._8_4_ = fVar235 * local_1e0._8_4_;
    auVar45._12_4_ = fVar213 * local_1e0._12_4_;
    auVar45._16_4_ = fVar236 * local_1e0._16_4_;
    auVar45._20_4_ = fVar214 * local_1e0._20_4_;
    auVar45._24_4_ = fVar237 * local_1e0._24_4_;
    auVar45._28_4_ = auVar25._28_4_ + auVar24._28_4_;
    auVar46._4_4_ = auVar21._4_4_ * fVar238;
    auVar46._0_4_ = auVar21._0_4_ * fVar215;
    auVar46._8_4_ = auVar21._8_4_ * fVar216;
    auVar46._12_4_ = auVar21._12_4_ * fVar240;
    auVar46._16_4_ = auVar21._16_4_ * fVar189;
    auVar46._20_4_ = auVar21._20_4_ * fVar190;
    auVar46._24_4_ = auVar21._24_4_ * fVar191;
    auVar46._28_4_ = auVar26._28_4_ + auVar19._28_4_;
    auVar24 = vsubps_avx(auVar45,auVar46);
    auVar17 = vminps_avx(auVar91,auVar20);
    auVar90 = vmaxps_avx(auVar91,auVar20);
    auVar18 = vminps_avx(auVar92,auVar122);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar92,auVar122);
    auVar90 = vmaxps_avx(auVar90,auVar17);
    auVar19 = vminps_avx(auVar123,auVar23);
    auVar17 = vmaxps_avx(auVar123,auVar23);
    auVar20 = vminps_avx(auVar124,auVar24);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar20 = vminps_avx(auVar18,auVar20);
    auVar18 = vmaxps_avx(auVar124,auVar24);
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar90,auVar17);
    auVar90 = vcmpps_avx(auVar20,local_1c0,2);
    auVar17 = vcmpps_avx(auVar17,local_360,5);
    auVar90 = vandps_avx(auVar17,auVar90);
    auVar17 = local_2c0 & auVar90;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar17 = vsubps_avx(_local_560,local_200);
      auVar18 = vsubps_avx(auVar21,auVar255);
      fVar212 = auVar17._0_4_ + auVar18._0_4_;
      fVar235 = auVar17._4_4_ + auVar18._4_4_;
      fVar213 = auVar17._8_4_ + auVar18._8_4_;
      fVar236 = auVar17._12_4_ + auVar18._12_4_;
      fVar214 = auVar17._16_4_ + auVar18._16_4_;
      fVar237 = auVar17._20_4_ + auVar18._20_4_;
      fVar215 = auVar17._24_4_ + auVar18._24_4_;
      auVar20 = vsubps_avx(local_220,auVar167);
      auVar23 = vsubps_avx(local_1e0,auVar279);
      fVar238 = auVar20._0_4_ + auVar23._0_4_;
      fVar216 = auVar20._4_4_ + auVar23._4_4_;
      fVar240 = auVar20._8_4_ + auVar23._8_4_;
      fVar189 = auVar20._12_4_ + auVar23._12_4_;
      fVar190 = auVar20._16_4_ + auVar23._16_4_;
      fVar191 = auVar20._20_4_ + auVar23._20_4_;
      fVar303 = auVar20._24_4_ + auVar23._24_4_;
      fVar218 = auVar23._28_4_;
      auVar47._4_4_ = auVar167._4_4_ * fVar235;
      auVar47._0_4_ = auVar167._0_4_ * fVar212;
      auVar47._8_4_ = auVar167._8_4_ * fVar213;
      auVar47._12_4_ = auVar167._12_4_ * fVar236;
      auVar47._16_4_ = auVar167._16_4_ * fVar214;
      auVar47._20_4_ = auVar167._20_4_ * fVar237;
      auVar47._24_4_ = auVar167._24_4_ * fVar215;
      auVar47._28_4_ = auVar167._28_4_;
      auVar48._4_4_ = local_200._4_4_ * fVar216;
      auVar48._0_4_ = local_200._0_4_ * fVar238;
      auVar48._8_4_ = local_200._8_4_ * fVar240;
      auVar48._12_4_ = local_200._12_4_ * fVar189;
      auVar48._16_4_ = local_200._16_4_ * fVar190;
      auVar48._20_4_ = local_200._20_4_ * fVar191;
      auVar48._24_4_ = local_200._24_4_ * fVar303;
      auVar48._28_4_ = local_200._28_4_;
      auVar23 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar235 * fStack_25c;
      auVar49._0_4_ = fVar212 * local_260;
      auVar49._8_4_ = fVar213 * fStack_258;
      auVar49._12_4_ = fVar236 * fStack_254;
      auVar49._16_4_ = fVar214 * fStack_250;
      auVar49._20_4_ = fVar237 * fStack_24c;
      auVar49._24_4_ = fVar215 * fStack_248;
      auVar49._28_4_ = auVar167._28_4_;
      auVar50._4_4_ = fVar216 * fStack_23c;
      auVar50._0_4_ = fVar238 * local_240;
      auVar50._8_4_ = fVar240 * fStack_238;
      auVar50._12_4_ = fVar189 * fStack_234;
      auVar50._16_4_ = fVar190 * fStack_230;
      auVar50._20_4_ = fVar191 * fStack_22c;
      auVar50._24_4_ = fVar303 * fStack_228;
      auVar50._28_4_ = fVar218;
      auVar24 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar235 * (float)local_600._4_4_;
      auVar51._0_4_ = fVar212 * (float)local_600._0_4_;
      auVar51._8_4_ = fVar213 * fStack_5f8;
      auVar51._12_4_ = fVar236 * fStack_5f4;
      auVar51._16_4_ = fVar214 * fStack_5f0;
      auVar51._20_4_ = fVar237 * fStack_5ec;
      auVar51._24_4_ = fVar215 * fStack_5e8;
      auVar51._28_4_ = fVar218;
      auVar52._4_4_ = fVar216 * (float)local_6a0._4_4_;
      auVar52._0_4_ = fVar238 * (float)local_6a0._0_4_;
      auVar52._8_4_ = fVar240 * fStack_698;
      auVar52._12_4_ = fVar189 * fStack_694;
      auVar52._16_4_ = fVar190 * fStack_690;
      auVar52._20_4_ = fVar191 * fStack_68c;
      auVar52._24_4_ = fVar303 * fStack_688;
      auVar52._28_4_ = auVar19._28_4_;
      auVar25 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = local_220._4_4_ * fVar235;
      auVar53._0_4_ = local_220._0_4_ * fVar212;
      auVar53._8_4_ = local_220._8_4_ * fVar213;
      auVar53._12_4_ = local_220._12_4_ * fVar236;
      auVar53._16_4_ = local_220._16_4_ * fVar214;
      auVar53._20_4_ = local_220._20_4_ * fVar237;
      auVar53._24_4_ = local_220._24_4_ * fVar215;
      auVar53._28_4_ = auVar19._28_4_;
      auVar54._4_4_ = local_560._4_4_ * fVar216;
      auVar54._0_4_ = local_560._0_4_ * fVar238;
      auVar54._8_4_ = local_560._8_4_ * fVar240;
      auVar54._12_4_ = local_560._12_4_ * fVar189;
      auVar54._16_4_ = local_560._16_4_ * fVar190;
      auVar54._20_4_ = local_560._20_4_ * fVar191;
      uVar6 = local_560._28_4_;
      auVar54._24_4_ = local_560._24_4_ * fVar303;
      auVar54._28_4_ = uVar6;
      auVar26 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = auVar279._4_4_ * fVar235;
      auVar55._0_4_ = auVar279._0_4_ * fVar212;
      auVar55._8_4_ = auVar279._8_4_ * fVar213;
      auVar55._12_4_ = auVar279._12_4_ * fVar236;
      auVar55._16_4_ = auVar279._16_4_ * fVar214;
      auVar55._20_4_ = auVar279._20_4_ * fVar237;
      auVar55._24_4_ = auVar279._24_4_ * fVar215;
      auVar55._28_4_ = uVar6;
      auVar56._4_4_ = auVar255._4_4_ * fVar216;
      auVar56._0_4_ = auVar255._0_4_ * fVar238;
      auVar56._8_4_ = auVar255._8_4_ * fVar240;
      auVar56._12_4_ = auVar255._12_4_ * fVar189;
      auVar56._16_4_ = auVar255._16_4_ * fVar190;
      auVar56._20_4_ = auVar255._20_4_ * fVar191;
      auVar56._24_4_ = auVar255._24_4_ * fVar303;
      auVar56._28_4_ = auVar255._28_4_;
      auVar91 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = fVar235 * fStack_29c;
      auVar57._0_4_ = fVar212 * local_2a0;
      auVar57._8_4_ = fVar213 * fStack_298;
      auVar57._12_4_ = fVar236 * fStack_294;
      auVar57._16_4_ = fVar214 * fStack_290;
      auVar57._20_4_ = fVar237 * fStack_28c;
      auVar57._24_4_ = fVar215 * fStack_288;
      auVar57._28_4_ = uVar6;
      auVar58._4_4_ = fVar216 * fStack_27c;
      auVar58._0_4_ = fVar238 * local_280;
      auVar58._8_4_ = fVar240 * fStack_278;
      auVar58._12_4_ = fVar189 * fStack_274;
      auVar58._16_4_ = fVar190 * fStack_270;
      auVar58._20_4_ = fVar191 * fStack_26c;
      auVar58._24_4_ = fVar303 * fStack_268;
      auVar58._28_4_ = auVar279._28_4_;
      auVar92 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar235 * auVar22._4_4_;
      auVar59._0_4_ = fVar212 * auVar22._0_4_;
      auVar59._8_4_ = fVar213 * auVar22._8_4_;
      auVar59._12_4_ = fVar236 * auVar22._12_4_;
      auVar59._16_4_ = fVar214 * auVar22._16_4_;
      auVar59._20_4_ = fVar237 * auVar22._20_4_;
      auVar59._24_4_ = fVar215 * auVar22._24_4_;
      auVar59._28_4_ = auVar279._28_4_;
      auVar60._4_4_ = fStack_5dc * fVar216;
      auVar60._0_4_ = local_5e0 * fVar238;
      auVar60._8_4_ = fStack_5d8 * fVar240;
      auVar60._12_4_ = fStack_5d4 * fVar189;
      auVar60._16_4_ = fStack_5d0 * fVar190;
      auVar60._20_4_ = fStack_5cc * fVar191;
      auVar60._24_4_ = fStack_5c8 * fVar303;
      auVar60._28_4_ = local_220._28_4_;
      auVar22 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = local_1e0._4_4_ * fVar235;
      auVar61._0_4_ = local_1e0._0_4_ * fVar212;
      auVar61._8_4_ = local_1e0._8_4_ * fVar213;
      auVar61._12_4_ = local_1e0._12_4_ * fVar236;
      auVar61._16_4_ = local_1e0._16_4_ * fVar214;
      auVar61._20_4_ = local_1e0._20_4_ * fVar237;
      auVar61._24_4_ = local_1e0._24_4_ * fVar215;
      auVar61._28_4_ = auVar17._28_4_ + auVar18._28_4_;
      auVar62._4_4_ = auVar21._4_4_ * fVar216;
      auVar62._0_4_ = auVar21._0_4_ * fVar238;
      auVar62._8_4_ = auVar21._8_4_ * fVar240;
      auVar62._12_4_ = auVar21._12_4_ * fVar189;
      auVar62._16_4_ = auVar21._16_4_ * fVar190;
      auVar62._20_4_ = auVar21._20_4_ * fVar191;
      auVar62._24_4_ = auVar21._24_4_ * fVar303;
      auVar62._28_4_ = auVar20._28_4_ + fVar218;
      auVar122 = vsubps_avx(auVar61,auVar62);
      auVar18 = vminps_avx(auVar23,auVar24);
      auVar17 = vmaxps_avx(auVar23,auVar24);
      auVar19 = vminps_avx(auVar25,auVar26);
      auVar19 = vminps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar25,auVar26);
      auVar17 = vmaxps_avx(auVar17,auVar18);
      auVar20 = vminps_avx(auVar91,auVar92);
      auVar18 = vmaxps_avx(auVar91,auVar92);
      auVar21 = vminps_avx(auVar22,auVar122);
      auVar20 = vminps_avx(auVar20,auVar21);
      auVar20 = vminps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar22,auVar122);
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar17,auVar18);
      auVar17 = vcmpps_avx(auVar20,local_1c0,2);
      auVar18 = vcmpps_avx(auVar18,local_360,5);
      auVar17 = vandps_avx(auVar18,auVar17);
      auVar90 = vandps_avx(local_2c0,auVar90);
      auVar18 = auVar90 & auVar17;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar90 = vandps_avx(auVar17,auVar90);
        uVar70 = vmovmskps_avx(auVar90);
        if (uVar70 != 0) {
          uVar67 = (ulong)uVar73;
          auStack_4b0[uVar67] = uVar70 & 0xff;
          uVar7 = vmovlps_avx(local_420);
          *(undefined8 *)(afStack_340 + uVar67 * 2) = uVar7;
          uVar72 = vmovlps_avx(auVar101);
          auStack_1a0[uVar67] = uVar72;
          uVar73 = uVar73 + 1;
        }
      }
    }
LAB_0100e627:
    do {
      do {
        do {
          do {
            if (uVar73 == 0) {
              if (bVar74) {
                return bVar74;
              }
              uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar100._4_4_ = uVar6;
              auVar100._0_4_ = uVar6;
              auVar100._8_4_ = uVar6;
              auVar100._12_4_ = uVar6;
              auVar100._16_4_ = uVar6;
              auVar100._20_4_ = uVar6;
              auVar100._24_4_ = uVar6;
              auVar100._28_4_ = uVar6;
              auVar90 = vcmpps_avx(local_2e0,auVar100,2);
              uVar65 = vmovmskps_avx(auVar90);
              uVar65 = (uint)uVar68 & uVar65;
              if (uVar65 == 0) {
                return bVar74;
              }
              goto LAB_0100d753;
            }
            uVar67 = (ulong)(uVar73 - 1);
            uVar70 = auStack_4b0[uVar67];
            fVar218 = afStack_340[uVar67 * 2];
            fVar212 = afStack_340[uVar67 * 2 + 1];
            auVar226._8_8_ = 0;
            auVar226._0_8_ = auStack_1a0[uVar67];
            auVar234 = ZEXT1664(auVar226);
            uVar72 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar72 & 1) == 0; uVar72 = uVar72 + 1) {
              }
            }
            uVar70 = uVar70 - 1 & uVar70;
            auStack_4b0[uVar67] = uVar70;
            if (uVar70 == 0) {
              uVar73 = uVar73 - 1;
            }
            fVar213 = (float)(uVar72 + 1) * 0.14285715;
            fVar235 = (1.0 - (float)uVar72 * 0.14285715) * fVar218 +
                      fVar212 * (float)uVar72 * 0.14285715;
            fVar218 = (1.0 - fVar213) * fVar218 + fVar212 * fVar213;
            fVar212 = fVar218 - fVar235;
            if (0.16666667 <= fVar212) {
              auVar150 = vinsertps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar218),0x10);
              auVar322 = ZEXT1664(auVar150);
              goto LAB_0100dfbc;
            }
            auVar150 = vshufps_avx(auVar226,auVar226,0x50);
            auVar104._8_4_ = 0x3f800000;
            auVar104._0_8_ = 0x3f8000003f800000;
            auVar104._12_4_ = 0x3f800000;
            auVar223 = vsubps_avx(auVar104,auVar150);
            fVar215 = auVar150._0_4_;
            fVar238 = auVar150._4_4_;
            fVar216 = auVar150._8_4_;
            fVar240 = auVar150._12_4_;
            fVar213 = auVar223._0_4_;
            fVar236 = auVar223._4_4_;
            fVar214 = auVar223._8_4_;
            fVar237 = auVar223._12_4_;
            auVar135._0_4_ = fVar215 * auVar200._0_4_ + fVar217 * fVar213;
            auVar135._4_4_ = fVar238 * auVar200._4_4_ + fVar186 * fVar236;
            auVar135._8_4_ = fVar216 * auVar200._0_4_ + fVar217 * fVar214;
            auVar135._12_4_ = fVar240 * auVar200._4_4_ + fVar186 * fVar237;
            auVar172._0_4_ = auVar307._0_4_ * fVar215 + fVar241 * fVar213;
            auVar172._4_4_ = auVar307._4_4_ * fVar238 + fVar187 * fVar236;
            auVar172._8_4_ = auVar307._0_4_ * fVar216 + fVar241 * fVar214;
            auVar172._12_4_ = auVar307._4_4_ * fVar240 + fVar187 * fVar237;
            auVar201._0_4_ = auVar287._0_4_ * fVar215 + fVar168 * fVar213;
            auVar201._4_4_ = auVar287._4_4_ * fVar238 + fVar188 * fVar236;
            auVar201._8_4_ = auVar287._0_4_ * fVar216 + fVar168 * fVar214;
            auVar201._12_4_ = auVar287._4_4_ * fVar240 + fVar188 * fVar237;
            auVar77._0_4_ = auVar271._0_4_ * fVar215 + auVar318._0_4_ * fVar213;
            auVar77._4_4_ = auVar271._4_4_ * fVar238 + auVar318._4_4_ * fVar236;
            auVar77._8_4_ = auVar271._0_4_ * fVar216 + auVar318._0_4_ * fVar214;
            auVar77._12_4_ = auVar271._4_4_ * fVar240 + auVar318._4_4_ * fVar237;
            auVar127._16_16_ = auVar135;
            auVar127._0_16_ = auVar135;
            auVar154._16_16_ = auVar172;
            auVar154._0_16_ = auVar172;
            auVar185._16_16_ = auVar201;
            auVar185._0_16_ = auVar201;
            auVar90 = ZEXT2032(CONCAT416(fVar218,ZEXT416((uint)fVar235)));
            auVar90 = vshufps_avx(auVar90,auVar90,0);
            auVar17 = vsubps_avx(auVar154,auVar127);
            fVar213 = auVar90._0_4_;
            fVar236 = auVar90._4_4_;
            fVar214 = auVar90._8_4_;
            fVar237 = auVar90._12_4_;
            fVar215 = auVar90._16_4_;
            fVar238 = auVar90._20_4_;
            fVar216 = auVar90._24_4_;
            auVar128._0_4_ = auVar135._0_4_ + auVar17._0_4_ * fVar213;
            auVar128._4_4_ = auVar135._4_4_ + auVar17._4_4_ * fVar236;
            auVar128._8_4_ = auVar135._8_4_ + auVar17._8_4_ * fVar214;
            auVar128._12_4_ = auVar135._12_4_ + auVar17._12_4_ * fVar237;
            auVar128._16_4_ = auVar135._0_4_ + auVar17._16_4_ * fVar215;
            auVar128._20_4_ = auVar135._4_4_ + auVar17._20_4_ * fVar238;
            auVar128._24_4_ = auVar135._8_4_ + auVar17._24_4_ * fVar216;
            auVar128._28_4_ = auVar135._12_4_ + auVar17._28_4_;
            auVar90 = vsubps_avx(auVar185,auVar154);
            auVar155._0_4_ = auVar172._0_4_ + auVar90._0_4_ * fVar213;
            auVar155._4_4_ = auVar172._4_4_ + auVar90._4_4_ * fVar236;
            auVar155._8_4_ = auVar172._8_4_ + auVar90._8_4_ * fVar214;
            auVar155._12_4_ = auVar172._12_4_ + auVar90._12_4_ * fVar237;
            auVar155._16_4_ = auVar172._0_4_ + auVar90._16_4_ * fVar215;
            auVar155._20_4_ = auVar172._4_4_ + auVar90._20_4_ * fVar238;
            auVar155._24_4_ = auVar172._8_4_ + auVar90._24_4_ * fVar216;
            auVar155._28_4_ = auVar172._12_4_ + auVar90._28_4_;
            auVar150 = vsubps_avx(auVar77,auVar201);
            auVar97._0_4_ = auVar201._0_4_ + auVar150._0_4_ * fVar213;
            auVar97._4_4_ = auVar201._4_4_ + auVar150._4_4_ * fVar236;
            auVar97._8_4_ = auVar201._8_4_ + auVar150._8_4_ * fVar214;
            auVar97._12_4_ = auVar201._12_4_ + auVar150._12_4_ * fVar237;
            auVar97._16_4_ = auVar201._0_4_ + auVar150._0_4_ * fVar215;
            auVar97._20_4_ = auVar201._4_4_ + auVar150._4_4_ * fVar238;
            auVar97._24_4_ = auVar201._8_4_ + auVar150._8_4_ * fVar216;
            auVar97._28_4_ = auVar201._12_4_ + auVar150._12_4_;
            auVar90 = vsubps_avx(auVar155,auVar128);
            auVar129._0_4_ = auVar128._0_4_ + fVar213 * auVar90._0_4_;
            auVar129._4_4_ = auVar128._4_4_ + fVar236 * auVar90._4_4_;
            auVar129._8_4_ = auVar128._8_4_ + fVar214 * auVar90._8_4_;
            auVar129._12_4_ = auVar128._12_4_ + fVar237 * auVar90._12_4_;
            auVar129._16_4_ = auVar128._16_4_ + fVar215 * auVar90._16_4_;
            auVar129._20_4_ = auVar128._20_4_ + fVar238 * auVar90._20_4_;
            auVar129._24_4_ = auVar128._24_4_ + fVar216 * auVar90._24_4_;
            auVar129._28_4_ = auVar128._28_4_ + auVar90._28_4_;
            auVar90 = vsubps_avx(auVar97,auVar155);
            auVar98._0_4_ = auVar155._0_4_ + fVar213 * auVar90._0_4_;
            auVar98._4_4_ = auVar155._4_4_ + fVar236 * auVar90._4_4_;
            auVar98._8_4_ = auVar155._8_4_ + fVar214 * auVar90._8_4_;
            auVar98._12_4_ = auVar155._12_4_ + fVar237 * auVar90._12_4_;
            auVar98._16_4_ = auVar155._16_4_ + fVar215 * auVar90._16_4_;
            auVar98._20_4_ = auVar155._20_4_ + fVar238 * auVar90._20_4_;
            auVar98._24_4_ = auVar155._24_4_ + fVar216 * auVar90._24_4_;
            auVar98._28_4_ = auVar155._28_4_ + auVar90._28_4_;
            auVar90 = vsubps_avx(auVar98,auVar129);
            auVar227._0_4_ = auVar129._0_4_ + fVar213 * auVar90._0_4_;
            auVar227._4_4_ = auVar129._4_4_ + fVar236 * auVar90._4_4_;
            auVar227._8_4_ = auVar129._8_4_ + fVar214 * auVar90._8_4_;
            auVar227._12_4_ = auVar129._12_4_ + fVar237 * auVar90._12_4_;
            auVar233._16_4_ = auVar129._16_4_ + fVar215 * auVar90._16_4_;
            auVar233._0_16_ = auVar227;
            auVar233._20_4_ = auVar129._20_4_ + fVar238 * auVar90._20_4_;
            auVar233._24_4_ = auVar129._24_4_ + fVar216 * auVar90._24_4_;
            auVar233._28_4_ = auVar129._28_4_ + auVar155._28_4_;
            auVar239 = auVar233._16_16_;
            auVar106 = vshufps_avx(ZEXT416((uint)(fVar212 * 0.33333334)),
                                   ZEXT416((uint)(fVar212 * 0.33333334)),0);
            auVar202._0_4_ = auVar227._0_4_ + auVar106._0_4_ * auVar90._0_4_ * 3.0;
            auVar202._4_4_ = auVar227._4_4_ + auVar106._4_4_ * auVar90._4_4_ * 3.0;
            auVar202._8_4_ = auVar227._8_4_ + auVar106._8_4_ * auVar90._8_4_ * 3.0;
            auVar202._12_4_ = auVar227._12_4_ + auVar106._12_4_ * auVar90._12_4_ * 3.0;
            auVar148 = vshufpd_avx(auVar227,auVar227,3);
            auVar117 = vshufpd_avx(auVar239,auVar239,3);
            _local_560 = auVar148;
            auVar150 = vsubps_avx(auVar148,auVar227);
            auVar223 = vsubps_avx(auVar117,auVar239);
            auVar78._0_4_ = auVar150._0_4_ + auVar223._0_4_;
            auVar78._4_4_ = auVar150._4_4_ + auVar223._4_4_;
            auVar78._8_4_ = auVar150._8_4_ + auVar223._8_4_;
            auVar78._12_4_ = auVar150._12_4_ + auVar223._12_4_;
            auVar150 = vmovshdup_avx(auVar227);
            auVar223 = vmovshdup_avx(auVar202);
            auVar138 = vshufps_avx(auVar78,auVar78,0);
            auVar107 = vshufps_avx(auVar78,auVar78,0x55);
            fVar213 = auVar107._0_4_;
            fVar236 = auVar107._4_4_;
            fVar214 = auVar107._8_4_;
            fVar237 = auVar107._12_4_;
            fVar215 = auVar138._0_4_;
            fVar238 = auVar138._4_4_;
            fVar216 = auVar138._8_4_;
            fVar240 = auVar138._12_4_;
            auVar79._0_4_ = fVar215 * auVar227._0_4_ + auVar150._0_4_ * fVar213;
            auVar79._4_4_ = fVar238 * auVar227._4_4_ + auVar150._4_4_ * fVar236;
            auVar79._8_4_ = fVar216 * auVar227._8_4_ + auVar150._8_4_ * fVar214;
            auVar79._12_4_ = fVar240 * auVar227._12_4_ + auVar150._12_4_ * fVar237;
            auVar136._0_4_ = fVar215 * auVar202._0_4_ + auVar223._0_4_ * fVar213;
            auVar136._4_4_ = fVar238 * auVar202._4_4_ + auVar223._4_4_ * fVar236;
            auVar136._8_4_ = fVar216 * auVar202._8_4_ + auVar223._8_4_ * fVar214;
            auVar136._12_4_ = fVar240 * auVar202._12_4_ + auVar223._12_4_ * fVar237;
            auVar223 = vshufps_avx(auVar79,auVar79,0xe8);
            auVar138 = vshufps_avx(auVar136,auVar136,0xe8);
            auVar150 = vcmpps_avx(auVar223,auVar138,1);
            uVar70 = vextractps_avx(auVar150,0);
            auVar107 = auVar136;
            if ((uVar70 & 1) == 0) {
              auVar107 = auVar79;
            }
            auVar105._0_4_ = auVar106._0_4_ * auVar90._16_4_ * 3.0;
            auVar105._4_4_ = auVar106._4_4_ * auVar90._20_4_ * 3.0;
            auVar105._8_4_ = auVar106._8_4_ * auVar90._24_4_ * 3.0;
            auVar105._12_4_ = auVar106._12_4_ * 0.0;
            auVar75 = vsubps_avx(auVar239,auVar105);
            auVar106 = vmovshdup_avx(auVar75);
            auVar239 = vmovshdup_avx(auVar239);
            fVar189 = auVar75._0_4_;
            fVar190 = auVar75._4_4_;
            auVar173._0_4_ = fVar189 * fVar215 + auVar106._0_4_ * fVar213;
            auVar173._4_4_ = fVar190 * fVar238 + auVar106._4_4_ * fVar236;
            auVar173._8_4_ = auVar75._8_4_ * fVar216 + auVar106._8_4_ * fVar214;
            auVar173._12_4_ = auVar75._12_4_ * fVar240 + auVar106._12_4_ * fVar237;
            auVar203._0_4_ = fVar215 * auVar233._16_4_ + auVar239._0_4_ * fVar213;
            auVar203._4_4_ = fVar238 * auVar233._20_4_ + auVar239._4_4_ * fVar236;
            auVar203._8_4_ = fVar216 * auVar233._24_4_ + auVar239._8_4_ * fVar214;
            auVar203._12_4_ = fVar240 * auVar233._28_4_ + auVar239._12_4_ * fVar237;
            auVar239 = vshufps_avx(auVar173,auVar173,0xe8);
            auVar269 = vshufps_avx(auVar203,auVar203,0xe8);
            auVar106 = vcmpps_avx(auVar239,auVar269,1);
            uVar70 = vextractps_avx(auVar106,0);
            auVar101 = auVar203;
            if ((uVar70 & 1) == 0) {
              auVar101 = auVar173;
            }
            auVar107 = vmaxss_avx(auVar101,auVar107);
            auVar223 = vminps_avx(auVar223,auVar138);
            auVar138 = vminps_avx(auVar239,auVar269);
            auVar138 = vminps_avx(auVar223,auVar138);
            auVar150 = vshufps_avx(auVar150,auVar150,0x55);
            auVar150 = vblendps_avx(auVar150,auVar106,2);
            auVar106 = vpslld_avx(auVar150,0x1f);
            auVar150 = vshufpd_avx(auVar136,auVar136,1);
            auVar150 = vinsertps_avx(auVar150,auVar203,0x9c);
            auVar223 = vshufpd_avx(auVar79,auVar79,1);
            auVar223 = vinsertps_avx(auVar223,auVar173,0x9c);
            auVar150 = vblendvps_avx(auVar223,auVar150,auVar106);
            auVar223 = vmovshdup_avx(auVar150);
            auVar150 = vmaxss_avx(auVar223,auVar150);
            fVar214 = auVar138._0_4_;
            auVar223 = vmovshdup_avx(auVar138);
            fVar236 = auVar150._0_4_;
            fVar237 = auVar223._0_4_;
            fVar213 = auVar107._0_4_;
            if ((fVar214 < 0.0001) && (-0.0001 < fVar236)) break;
            if ((fVar237 < 0.0001 && -0.0001 < fVar213) || (fVar214 < 0.0001 && -0.0001 < fVar213))
            break;
            auVar106 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar150,1);
            auVar223 = vcmpps_avx(auVar223,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar223 = vandps_avx(auVar223,auVar106);
          } while ((auVar223 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar106 = vcmpps_avx(auVar138,_DAT_01f7aa10,1);
          auVar223 = vcmpss_avx(auVar107,ZEXT416(0),1);
          auVar137._8_4_ = 0x3f800000;
          auVar137._0_8_ = 0x3f8000003f800000;
          auVar137._12_4_ = 0x3f800000;
          auVar174._8_4_ = 0xbf800000;
          auVar174._0_8_ = 0xbf800000bf800000;
          auVar174._12_4_ = 0xbf800000;
          auVar223 = vblendvps_avx(auVar137,auVar174,auVar223);
          auVar106 = vblendvps_avx(auVar137,auVar174,auVar106);
          auVar138 = vcmpss_avx(auVar106,auVar223,4);
          auVar138 = vpshufd_avx(ZEXT416(auVar138._0_4_ & 1),0x50);
          auVar138 = vpslld_avx(auVar138,0x1f);
          auVar138 = vpsrad_avx(auVar138,0x1f);
          auVar138 = vpandn_avx(auVar138,_DAT_01fafeb0);
          auVar107 = vmovshdup_avx(auVar106);
          fVar215 = auVar107._0_4_;
          local_640._0_4_ = auVar8._0_4_;
          local_640._4_4_ = auVar8._4_4_;
          fStack_638 = auVar8._8_4_;
          fStack_634 = auVar8._12_4_;
          if ((auVar106._0_4_ != fVar215) || (NAN(auVar106._0_4_) || NAN(fVar215))) {
            if ((fVar237 != fVar214) || (NAN(fVar237) || NAN(fVar214))) {
              fVar214 = -fVar214 / (fVar237 - fVar214);
              auVar106 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar214) * 0.0 + fVar214)));
            }
            else {
              auVar106 = ZEXT816(0x3f80000000000000);
              if ((fVar214 != 0.0) || (NAN(fVar214))) {
                auVar106 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar239 = vcmpps_avx(auVar138,auVar106,1);
            auVar107 = vblendps_avx(auVar138,auVar106,2);
            auVar106 = vblendps_avx(auVar106,auVar138,2);
            auVar138 = vblendvps_avx(auVar106,auVar107,auVar239);
          }
          auVar150 = vcmpss_avx(auVar150,ZEXT416(0),1);
          auVar139._8_4_ = 0x3f800000;
          auVar139._0_8_ = 0x3f8000003f800000;
          auVar139._12_4_ = 0x3f800000;
          auVar175._8_4_ = 0xbf800000;
          auVar175._0_8_ = 0xbf800000bf800000;
          auVar175._12_4_ = 0xbf800000;
          auVar150 = vblendvps_avx(auVar139,auVar175,auVar150);
          fVar214 = auVar150._0_4_;
          if ((auVar223._0_4_ != fVar214) || (NAN(auVar223._0_4_) || NAN(fVar214))) {
            if ((fVar236 != fVar213) || (NAN(fVar236) || NAN(fVar213))) {
              fVar213 = -fVar213 / (fVar236 - fVar213);
              auVar150 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar213) * 0.0 + fVar213)));
            }
            else {
              auVar150 = ZEXT816(0x3f80000000000000);
              if ((fVar213 != 0.0) || (NAN(fVar213))) {
                auVar150 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar106 = vcmpps_avx(auVar138,auVar150,1);
            auVar223 = vblendps_avx(auVar138,auVar150,2);
            auVar150 = vblendps_avx(auVar150,auVar138,2);
            auVar138 = vblendvps_avx(auVar150,auVar223,auVar106);
          }
          if ((fVar215 != fVar214) || (NAN(fVar215) || NAN(fVar214))) {
            auVar80._8_4_ = 0x3f800000;
            auVar80._0_8_ = 0x3f8000003f800000;
            auVar80._12_4_ = 0x3f800000;
            auVar150 = vcmpps_avx(auVar138,auVar80,1);
            auVar223 = vinsertps_avx(auVar138,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar140._4_12_ = auVar138._4_12_;
            auVar140._0_4_ = 0x3f800000;
            auVar138 = vblendvps_avx(auVar140,auVar223,auVar150);
          }
          auVar150 = vcmpps_avx(auVar138,_DAT_01f7b6f0,1);
          auVar63._12_4_ = 0;
          auVar63._0_12_ = auVar138._4_12_;
          auVar223 = vinsertps_avx(auVar138,ZEXT416(0x3f800000),0x10);
          auVar150 = vblendvps_avx(auVar223,auVar63 << 0x20,auVar150);
          auVar223 = vmovshdup_avx(auVar150);
        } while (auVar223._0_4_ < auVar150._0_4_);
        auVar81._0_4_ = auVar150._0_4_ + -0.1;
        auVar81._4_4_ = auVar150._4_4_ + 0.1;
        auVar81._8_4_ = auVar150._8_4_ + 0.0;
        auVar81._12_4_ = auVar150._12_4_ + 0.0;
        auVar106 = vshufpd_avx(auVar202,auVar202,3);
        auVar228._8_8_ = 0x3f80000000000000;
        auVar228._0_8_ = 0x3f80000000000000;
        auVar150 = vcmpps_avx(auVar81,auVar228,1);
        auVar64._12_4_ = 0;
        auVar64._0_12_ = auVar81._4_12_;
        auVar223 = vinsertps_avx(auVar81,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar150 = vblendvps_avx(auVar223,auVar64 << 0x20,auVar150);
        auVar223 = vshufpd_avx(auVar75,auVar75,3);
        auVar138 = vshufps_avx(auVar150,auVar150,0x50);
        auVar229._8_4_ = 0x3f800000;
        auVar229._0_8_ = 0x3f8000003f800000;
        auVar229._12_4_ = 0x3f800000;
        auVar107 = vsubps_avx(auVar229,auVar138);
        local_560._0_4_ = auVar148._0_4_;
        local_560._4_4_ = auVar148._4_4_;
        fStack_558 = auVar148._8_4_;
        fStack_554 = auVar148._12_4_;
        fVar213 = auVar138._0_4_;
        fVar236 = auVar138._4_4_;
        fVar214 = auVar138._8_4_;
        fVar237 = auVar138._12_4_;
        local_620 = auVar117._0_4_;
        fStack_61c = auVar117._4_4_;
        fStack_618 = auVar117._8_4_;
        fStack_614 = auVar117._12_4_;
        fVar215 = auVar107._0_4_;
        fVar238 = auVar107._4_4_;
        fVar216 = auVar107._8_4_;
        fVar240 = auVar107._12_4_;
        auVar82._0_4_ = fVar213 * (float)local_560._0_4_ + fVar215 * auVar227._0_4_;
        auVar82._4_4_ = fVar236 * (float)local_560._4_4_ + fVar238 * auVar227._4_4_;
        auVar82._8_4_ = fVar214 * fStack_558 + fVar216 * auVar227._0_4_;
        auVar82._12_4_ = fVar237 * fStack_554 + fVar240 * auVar227._4_4_;
        auVar141._0_4_ = fVar213 * auVar106._0_4_ + fVar215 * auVar202._0_4_;
        auVar141._4_4_ = fVar236 * auVar106._4_4_ + fVar238 * auVar202._4_4_;
        auVar141._8_4_ = fVar214 * auVar106._8_4_ + fVar216 * auVar202._0_4_;
        auVar141._12_4_ = fVar237 * auVar106._12_4_ + fVar240 * auVar202._4_4_;
        auVar204._0_4_ = fVar213 * auVar223._0_4_ + fVar215 * fVar189;
        auVar204._4_4_ = fVar236 * auVar223._4_4_ + fVar238 * fVar190;
        auVar204._8_4_ = fVar214 * auVar223._8_4_ + fVar216 * fVar189;
        auVar204._12_4_ = fVar237 * auVar223._12_4_ + fVar240 * fVar190;
        auVar248._0_4_ = fVar213 * local_620 + fVar215 * auVar233._16_4_;
        auVar248._4_4_ = fVar236 * fStack_61c + fVar238 * auVar233._20_4_;
        auVar248._8_4_ = fVar214 * fStack_618 + fVar216 * auVar233._16_4_;
        auVar248._12_4_ = fVar237 * fStack_614 + fVar240 * auVar233._20_4_;
        auVar117 = vsubps_avx(auVar229,auVar150);
        auVar223 = vmovshdup_avx(auVar226);
        auVar148 = vmovsldup_avx(auVar226);
        auVar230._0_4_ = auVar148._0_4_ * auVar117._0_4_ + auVar150._0_4_ * auVar223._0_4_;
        auVar230._4_4_ = auVar148._4_4_ * auVar117._4_4_ + auVar150._4_4_ * auVar223._4_4_;
        auVar230._8_4_ = auVar148._8_4_ * auVar117._8_4_ + auVar150._8_4_ * auVar223._8_4_;
        auVar230._12_4_ = auVar148._12_4_ * auVar117._12_4_ + auVar150._12_4_ * auVar223._12_4_;
        auVar75 = vmovshdup_avx(auVar230);
        auVar150 = vsubps_avx(auVar141,auVar82);
        auVar161._0_4_ = auVar150._0_4_ * 3.0;
        auVar161._4_4_ = auVar150._4_4_ * 3.0;
        auVar161._8_4_ = auVar150._8_4_ * 3.0;
        auVar161._12_4_ = auVar150._12_4_ * 3.0;
        auVar150 = vsubps_avx(auVar204,auVar141);
        auVar259._0_4_ = auVar150._0_4_ * 3.0;
        auVar259._4_4_ = auVar150._4_4_ * 3.0;
        auVar259._8_4_ = auVar150._8_4_ * 3.0;
        auVar259._12_4_ = auVar150._12_4_ * 3.0;
        auVar150 = vsubps_avx(auVar248,auVar204);
        auVar272._0_4_ = auVar150._0_4_ * 3.0;
        auVar272._4_4_ = auVar150._4_4_ * 3.0;
        auVar272._8_4_ = auVar150._8_4_ * 3.0;
        auVar272._12_4_ = auVar150._12_4_ * 3.0;
        auVar223 = vminps_avx(auVar259,auVar272);
        auVar150 = vmaxps_avx(auVar259,auVar272);
        auVar223 = vminps_avx(auVar161,auVar223);
        auVar150 = vmaxps_avx(auVar161,auVar150);
        auVar148 = vshufpd_avx(auVar223,auVar223,3);
        auVar117 = vshufpd_avx(auVar150,auVar150,3);
        auVar223 = vminps_avx(auVar223,auVar148);
        auVar150 = vmaxps_avx(auVar150,auVar117);
        auVar148 = vshufps_avx(ZEXT416((uint)(1.0 / fVar212)),ZEXT416((uint)(1.0 / fVar212)),0);
        auVar260._0_4_ = auVar223._0_4_ * auVar148._0_4_;
        auVar260._4_4_ = auVar223._4_4_ * auVar148._4_4_;
        auVar260._8_4_ = auVar223._8_4_ * auVar148._8_4_;
        auVar260._12_4_ = auVar223._12_4_ * auVar148._12_4_;
        auVar273._0_4_ = auVar148._0_4_ * auVar150._0_4_;
        auVar273._4_4_ = auVar148._4_4_ * auVar150._4_4_;
        auVar273._8_4_ = auVar148._8_4_ * auVar150._8_4_;
        auVar273._12_4_ = auVar148._12_4_ * auVar150._12_4_;
        auVar107 = ZEXT416((uint)(1.0 / (auVar75._0_4_ - auVar230._0_4_)));
        auVar150 = vshufpd_avx(auVar82,auVar82,3);
        auVar223 = vshufpd_avx(auVar141,auVar141,3);
        auVar148 = vshufpd_avx(auVar204,auVar204,3);
        auVar117 = vshufpd_avx(auVar248,auVar248,3);
        auVar150 = vsubps_avx(auVar150,auVar82);
        auVar106 = vsubps_avx(auVar223,auVar141);
        auVar138 = vsubps_avx(auVar148,auVar204);
        auVar117 = vsubps_avx(auVar117,auVar248);
        auVar223 = vminps_avx(auVar150,auVar106);
        auVar150 = vmaxps_avx(auVar150,auVar106);
        auVar148 = vminps_avx(auVar138,auVar117);
        auVar148 = vminps_avx(auVar223,auVar148);
        auVar223 = vmaxps_avx(auVar138,auVar117);
        auVar150 = vmaxps_avx(auVar150,auVar223);
        auVar223 = vshufps_avx(auVar107,auVar107,0);
        auVar319._0_4_ = auVar223._0_4_ * auVar148._0_4_;
        auVar319._4_4_ = auVar223._4_4_ * auVar148._4_4_;
        auVar319._8_4_ = auVar223._8_4_ * auVar148._8_4_;
        auVar319._12_4_ = auVar223._12_4_ * auVar148._12_4_;
        auVar329._0_4_ = auVar223._0_4_ * auVar150._0_4_;
        auVar329._4_4_ = auVar223._4_4_ * auVar150._4_4_;
        auVar329._8_4_ = auVar223._8_4_ * auVar150._8_4_;
        auVar329._12_4_ = auVar223._12_4_ * auVar150._12_4_;
        auVar150 = vmovsldup_avx(auVar230);
        auVar288._4_12_ = auVar150._4_12_;
        auVar288._0_4_ = fVar235;
        auVar296._4_12_ = auVar230._4_12_;
        auVar296._0_4_ = fVar218;
        auVar162._0_4_ = (fVar235 + fVar218) * 0.5;
        auVar162._4_4_ = (auVar150._4_4_ + auVar230._4_4_) * 0.5;
        auVar162._8_4_ = (auVar150._8_4_ + auVar230._8_4_) * 0.5;
        auVar162._12_4_ = (auVar150._12_4_ + auVar230._12_4_) * 0.5;
        auVar150 = vshufps_avx(auVar162,auVar162,0);
        fVar213 = auVar150._0_4_;
        fVar236 = auVar150._4_4_;
        fVar214 = auVar150._8_4_;
        fVar237 = auVar150._12_4_;
        auVar108._0_4_ = (float)local_640._0_4_ + fVar213 * (float)local_370._0_4_;
        auVar108._4_4_ = (float)local_640._4_4_ + fVar236 * (float)local_370._4_4_;
        auVar108._8_4_ = fStack_638 + fVar214 * fStack_368;
        auVar108._12_4_ = fStack_634 + fVar237 * fStack_364;
        local_630._0_4_ = auVar295._0_4_;
        local_630._4_4_ = auVar295._4_4_;
        fStack_628 = auVar295._8_4_;
        fStack_624 = auVar295._12_4_;
        auVar142._0_4_ = fVar213 * (float)local_380._0_4_ + (float)local_630._0_4_;
        auVar142._4_4_ = fVar236 * (float)local_380._4_4_ + (float)local_630._4_4_;
        auVar142._8_4_ = fVar214 * fStack_378 + fStack_628;
        auVar142._12_4_ = fVar237 * fStack_374 + fStack_624;
        local_5a0 = auVar9._0_4_;
        fStack_59c = auVar9._4_4_;
        fStack_598 = auVar9._8_4_;
        fStack_594 = auVar9._12_4_;
        auVar205._0_4_ = fVar213 * (float)local_390._0_4_ + local_5a0;
        auVar205._4_4_ = fVar236 * (float)local_390._4_4_ + fStack_59c;
        auVar205._8_4_ = fVar214 * fStack_388 + fStack_598;
        auVar205._12_4_ = fVar237 * fStack_384 + fStack_594;
        auVar150 = vsubps_avx(auVar142,auVar108);
        auVar109._0_4_ = auVar108._0_4_ + fVar213 * auVar150._0_4_;
        auVar109._4_4_ = auVar108._4_4_ + fVar236 * auVar150._4_4_;
        auVar109._8_4_ = auVar108._8_4_ + fVar214 * auVar150._8_4_;
        auVar109._12_4_ = auVar108._12_4_ + fVar237 * auVar150._12_4_;
        auVar150 = vsubps_avx(auVar205,auVar142);
        auVar143._0_4_ = auVar142._0_4_ + fVar213 * auVar150._0_4_;
        auVar143._4_4_ = auVar142._4_4_ + fVar236 * auVar150._4_4_;
        auVar143._8_4_ = auVar142._8_4_ + fVar214 * auVar150._8_4_;
        auVar143._12_4_ = auVar142._12_4_ + fVar237 * auVar150._12_4_;
        auVar150 = vsubps_avx(auVar143,auVar109);
        fVar213 = auVar109._0_4_ + fVar213 * auVar150._0_4_;
        fVar236 = auVar109._4_4_ + fVar236 * auVar150._4_4_;
        auVar83._0_8_ = CONCAT44(fVar236,fVar213);
        auVar83._8_4_ = auVar109._8_4_ + fVar214 * auVar150._8_4_;
        auVar83._12_4_ = auVar109._12_4_ + fVar237 * auVar150._12_4_;
        fVar214 = auVar150._0_4_ * 3.0;
        fVar237 = auVar150._4_4_ * 3.0;
        auVar110._0_8_ = CONCAT44(fVar237,fVar214);
        auVar110._8_4_ = auVar150._8_4_ * 3.0;
        auVar110._12_4_ = auVar150._12_4_ * 3.0;
        auVar144._8_8_ = auVar83._0_8_;
        auVar144._0_8_ = auVar83._0_8_;
        auVar150 = vshufpd_avx(auVar83,auVar83,3);
        auVar223 = vshufps_avx(auVar162,auVar162,0x55);
        auVar138 = vsubps_avx(auVar150,auVar144);
        auVar308._0_4_ = auVar138._0_4_ * auVar223._0_4_ + fVar213;
        auVar308._4_4_ = auVar138._4_4_ * auVar223._4_4_ + fVar236;
        auVar308._8_4_ = auVar138._8_4_ * auVar223._8_4_ + fVar213;
        auVar308._12_4_ = auVar138._12_4_ * auVar223._12_4_ + fVar236;
        auVar145._8_8_ = auVar110._0_8_;
        auVar145._0_8_ = auVar110._0_8_;
        auVar150 = vshufpd_avx(auVar110,auVar110,1);
        auVar150 = vsubps_avx(auVar150,auVar145);
        auVar111._0_4_ = auVar150._0_4_ * auVar223._0_4_ + fVar214;
        auVar111._4_4_ = auVar150._4_4_ * auVar223._4_4_ + fVar237;
        auVar111._8_4_ = auVar150._8_4_ * auVar223._8_4_ + fVar214;
        auVar111._12_4_ = auVar150._12_4_ * auVar223._12_4_ + fVar237;
        auVar223 = vmovshdup_avx(auVar111);
        auVar206._0_8_ = auVar223._0_8_ ^ 0x8000000080000000;
        auVar206._8_4_ = auVar223._8_4_ ^ 0x80000000;
        auVar206._12_4_ = auVar223._12_4_ ^ 0x80000000;
        auVar148 = vmovshdup_avx(auVar138);
        auVar150 = vunpcklps_avx(auVar148,auVar206);
        auVar117 = vshufps_avx(auVar150,auVar206,4);
        auVar84._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
        auVar84._8_4_ = -auVar138._8_4_;
        auVar84._12_4_ = -auVar138._12_4_;
        auVar150 = vmovlhps_avx(auVar84,auVar111);
        auVar106 = vshufps_avx(auVar150,auVar111,8);
        auVar150 = ZEXT416((uint)(auVar111._0_4_ * auVar148._0_4_ - auVar138._0_4_ * auVar223._0_4_)
                          );
        auVar223 = vshufps_avx(auVar150,auVar150,0);
        auVar150 = vdivps_avx(auVar117,auVar223);
        auVar223 = vdivps_avx(auVar106,auVar223);
        auVar106 = vinsertps_avx(auVar260,auVar319,0x1c);
        auVar138 = vinsertps_avx(auVar273,auVar329,0x1c);
        auVar107 = vinsertps_avx(auVar319,auVar260,0x4c);
        auVar239 = vinsertps_avx(auVar329,auVar273,0x4c);
        auVar148 = vmovsldup_avx(auVar150);
        auVar274._0_4_ = auVar106._0_4_ * auVar148._0_4_;
        auVar274._4_4_ = auVar106._4_4_ * auVar148._4_4_;
        auVar274._8_4_ = auVar106._8_4_ * auVar148._8_4_;
        auVar274._12_4_ = auVar106._12_4_ * auVar148._12_4_;
        auVar112._0_4_ = auVar148._0_4_ * auVar138._0_4_;
        auVar112._4_4_ = auVar148._4_4_ * auVar138._4_4_;
        auVar112._8_4_ = auVar148._8_4_ * auVar138._8_4_;
        auVar112._12_4_ = auVar148._12_4_ * auVar138._12_4_;
        auVar117 = vminps_avx(auVar274,auVar112);
        auVar148 = vmaxps_avx(auVar112,auVar274);
        auVar269 = vmovsldup_avx(auVar223);
        auVar330._0_4_ = auVar269._0_4_ * auVar107._0_4_;
        auVar330._4_4_ = auVar269._4_4_ * auVar107._4_4_;
        auVar330._8_4_ = auVar269._8_4_ * auVar107._8_4_;
        auVar330._12_4_ = auVar269._12_4_ * auVar107._12_4_;
        auVar275._0_4_ = auVar269._0_4_ * auVar239._0_4_;
        auVar275._4_4_ = auVar269._4_4_ * auVar239._4_4_;
        auVar275._8_4_ = auVar269._8_4_ * auVar239._8_4_;
        auVar275._12_4_ = auVar269._12_4_ * auVar239._12_4_;
        auVar269 = vminps_avx(auVar330,auVar275);
        auVar176._0_4_ = auVar117._0_4_ + auVar269._0_4_;
        auVar176._4_4_ = auVar117._4_4_ + auVar269._4_4_;
        auVar176._8_4_ = auVar117._8_4_ + auVar269._8_4_;
        auVar176._12_4_ = auVar117._12_4_ + auVar269._12_4_;
        auVar117 = vmaxps_avx(auVar275,auVar330);
        auVar269 = vsubps_avx(auVar288,auVar162);
        auVar101 = vsubps_avx(auVar296,auVar162);
        auVar113._0_4_ = auVar117._0_4_ + auVar148._0_4_;
        auVar113._4_4_ = auVar117._4_4_ + auVar148._4_4_;
        auVar113._8_4_ = auVar117._8_4_ + auVar148._8_4_;
        auVar113._12_4_ = auVar117._12_4_ + auVar148._12_4_;
        auVar297._8_8_ = 0x3f800000;
        auVar297._0_8_ = 0x3f800000;
        auVar148 = vsubps_avx(auVar297,auVar113);
        auVar117 = vsubps_avx(auVar297,auVar176);
        fVar216 = auVar269._0_4_;
        auVar298._0_4_ = fVar216 * auVar148._0_4_;
        fVar240 = auVar269._4_4_;
        auVar298._4_4_ = fVar240 * auVar148._4_4_;
        fVar189 = auVar269._8_4_;
        auVar298._8_4_ = fVar189 * auVar148._8_4_;
        fVar190 = auVar269._12_4_;
        auVar298._12_4_ = fVar190 * auVar148._12_4_;
        fVar214 = auVar101._0_4_;
        auVar114._0_4_ = fVar214 * auVar148._0_4_;
        fVar237 = auVar101._4_4_;
        auVar114._4_4_ = fVar237 * auVar148._4_4_;
        fVar215 = auVar101._8_4_;
        auVar114._8_4_ = fVar215 * auVar148._8_4_;
        fVar238 = auVar101._12_4_;
        auVar114._12_4_ = fVar238 * auVar148._12_4_;
        auVar320._0_4_ = fVar216 * auVar117._0_4_;
        auVar320._4_4_ = fVar240 * auVar117._4_4_;
        auVar320._8_4_ = fVar189 * auVar117._8_4_;
        auVar320._12_4_ = fVar190 * auVar117._12_4_;
        auVar177._0_4_ = fVar214 * auVar117._0_4_;
        auVar177._4_4_ = fVar237 * auVar117._4_4_;
        auVar177._8_4_ = fVar215 * auVar117._8_4_;
        auVar177._12_4_ = fVar238 * auVar117._12_4_;
        auVar148 = vminps_avx(auVar298,auVar320);
        auVar117 = vminps_avx(auVar114,auVar177);
        auVar269 = vminps_avx(auVar148,auVar117);
        auVar148 = vmaxps_avx(auVar320,auVar298);
        auVar117 = vmaxps_avx(auVar177,auVar114);
        auVar101 = vshufps_avx(auVar162,auVar162,0x54);
        auVar117 = vmaxps_avx(auVar117,auVar148);
        auVar102 = vshufps_avx(auVar308,auVar308,0);
        auVar131 = vshufps_avx(auVar308,auVar308,0x55);
        auVar148 = vhaddps_avx(auVar269,auVar269);
        auVar117 = vhaddps_avx(auVar117,auVar117);
        auVar178._0_4_ = auVar131._0_4_ * auVar223._0_4_ + auVar102._0_4_ * auVar150._0_4_;
        auVar178._4_4_ = auVar131._4_4_ * auVar223._4_4_ + auVar102._4_4_ * auVar150._4_4_;
        auVar178._8_4_ = auVar131._8_4_ * auVar223._8_4_ + auVar102._8_4_ * auVar150._8_4_;
        auVar178._12_4_ = auVar131._12_4_ * auVar223._12_4_ + auVar102._12_4_ * auVar150._12_4_;
        auVar269 = vsubps_avx(auVar101,auVar178);
        fVar213 = auVar269._0_4_ + auVar148._0_4_;
        fVar236 = auVar269._0_4_ + auVar117._0_4_;
        auVar148 = vmaxss_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar213));
        auVar117 = vminss_avx(ZEXT416((uint)fVar236),ZEXT416((uint)fVar218));
      } while (auVar117._0_4_ < auVar148._0_4_);
      auVar148 = vmovshdup_avx(auVar150);
      auVar179._0_4_ = auVar106._0_4_ * auVar148._0_4_;
      auVar179._4_4_ = auVar106._4_4_ * auVar148._4_4_;
      auVar179._8_4_ = auVar106._8_4_ * auVar148._8_4_;
      auVar179._12_4_ = auVar106._12_4_ * auVar148._12_4_;
      auVar115._0_4_ = auVar148._0_4_ * auVar138._0_4_;
      auVar115._4_4_ = auVar148._4_4_ * auVar138._4_4_;
      auVar115._8_4_ = auVar148._8_4_ * auVar138._8_4_;
      auVar115._12_4_ = auVar148._12_4_ * auVar138._12_4_;
      auVar117 = vminps_avx(auVar179,auVar115);
      auVar148 = vmaxps_avx(auVar115,auVar179);
      auVar106 = vmovshdup_avx(auVar223);
      auVar85._0_4_ = auVar106._0_4_ * auVar107._0_4_;
      auVar85._4_4_ = auVar106._4_4_ * auVar107._4_4_;
      auVar85._8_4_ = auVar106._8_4_ * auVar107._8_4_;
      auVar85._12_4_ = auVar106._12_4_ * auVar107._12_4_;
      auVar180._0_4_ = auVar239._0_4_ * auVar106._0_4_;
      auVar180._4_4_ = auVar239._4_4_ * auVar106._4_4_;
      auVar180._8_4_ = auVar239._8_4_ * auVar106._8_4_;
      auVar180._12_4_ = auVar239._12_4_ * auVar106._12_4_;
      auVar106 = vminps_avx(auVar85,auVar180);
      auVar146._0_4_ = auVar117._0_4_ + auVar106._0_4_;
      auVar146._4_4_ = auVar117._4_4_ + auVar106._4_4_;
      auVar146._8_4_ = auVar117._8_4_ + auVar106._8_4_;
      auVar146._12_4_ = auVar117._12_4_ + auVar106._12_4_;
      auVar117 = vmaxps_avx(auVar180,auVar85);
      auVar86._0_4_ = auVar148._0_4_ + auVar117._0_4_;
      auVar86._4_4_ = auVar148._4_4_ + auVar117._4_4_;
      auVar86._8_4_ = auVar148._8_4_ + auVar117._8_4_;
      auVar86._12_4_ = auVar148._12_4_ + auVar117._12_4_;
      auVar148 = vsubps_avx(auVar228,auVar86);
      auVar117 = vsubps_avx(auVar228,auVar146);
      auVar147._0_4_ = fVar216 * auVar148._0_4_;
      auVar147._4_4_ = fVar240 * auVar148._4_4_;
      auVar147._8_4_ = fVar189 * auVar148._8_4_;
      auVar147._12_4_ = fVar190 * auVar148._12_4_;
      auVar181._0_4_ = fVar216 * auVar117._0_4_;
      auVar181._4_4_ = fVar240 * auVar117._4_4_;
      auVar181._8_4_ = fVar189 * auVar117._8_4_;
      auVar181._12_4_ = fVar190 * auVar117._12_4_;
      auVar87._0_4_ = fVar214 * auVar148._0_4_;
      auVar87._4_4_ = fVar237 * auVar148._4_4_;
      auVar87._8_4_ = fVar215 * auVar148._8_4_;
      auVar87._12_4_ = fVar238 * auVar148._12_4_;
      auVar116._0_4_ = fVar214 * auVar117._0_4_;
      auVar116._4_4_ = fVar237 * auVar117._4_4_;
      auVar116._8_4_ = fVar215 * auVar117._8_4_;
      auVar116._12_4_ = fVar238 * auVar117._12_4_;
      auVar148 = vminps_avx(auVar147,auVar181);
      auVar117 = vminps_avx(auVar87,auVar116);
      auVar148 = vminps_avx(auVar148,auVar117);
      auVar117 = vmaxps_avx(auVar181,auVar147);
      auVar106 = vmaxps_avx(auVar116,auVar87);
      auVar148 = vhaddps_avx(auVar148,auVar148);
      auVar117 = vmaxps_avx(auVar106,auVar117);
      auVar117 = vhaddps_avx(auVar117,auVar117);
      auVar106 = vmovshdup_avx(auVar269);
      auVar234 = ZEXT1664(auVar230);
      auVar138 = ZEXT416((uint)(auVar106._0_4_ + auVar148._0_4_));
      auVar148 = vmaxss_avx(auVar230,auVar138);
      auVar106 = ZEXT416((uint)(auVar106._0_4_ + auVar117._0_4_));
      auVar117 = vminss_avx(auVar106,auVar75);
      auVar261._8_4_ = 0x7fffffff;
      auVar261._0_8_ = 0x7fffffff7fffffff;
      auVar261._12_4_ = 0x7fffffff;
    } while (auVar117._0_4_ < auVar148._0_4_);
    uVar70 = 0;
    if ((fVar235 < fVar213) && (fVar236 < fVar218)) {
      auVar148 = vcmpps_avx(auVar106,auVar75,1);
      auVar117 = vcmpps_avx(auVar230,auVar138,1);
      auVar148 = vandps_avx(auVar117,auVar148);
      uVar70 = auVar148._0_4_;
    }
    if ((3 < uVar73 || fVar212 < 0.001) || (uVar70 & 1) != 0) {
      lVar71 = 200;
      do {
        fVar212 = auVar269._0_4_;
        fVar218 = 1.0 - fVar212;
        auVar148 = ZEXT416((uint)(fVar218 * fVar218 * fVar218));
        auVar148 = vshufps_avx(auVar148,auVar148,0);
        auVar117 = ZEXT416((uint)(fVar212 * 3.0 * fVar218 * fVar218));
        auVar117 = vshufps_avx(auVar117,auVar117,0);
        auVar106 = ZEXT416((uint)(fVar218 * fVar212 * fVar212 * 3.0));
        auVar106 = vshufps_avx(auVar106,auVar106,0);
        auVar138 = ZEXT416((uint)(fVar212 * fVar212 * fVar212));
        auVar138 = vshufps_avx(auVar138,auVar138,0);
        fVar218 = (float)local_640._0_4_ * auVar148._0_4_ +
                  (float)local_630._0_4_ * auVar117._0_4_ +
                  (float)local_4c0._0_4_ * auVar138._0_4_ + local_5a0 * auVar106._0_4_;
        fVar212 = (float)local_640._4_4_ * auVar148._4_4_ +
                  (float)local_630._4_4_ * auVar117._4_4_ +
                  (float)local_4c0._4_4_ * auVar138._4_4_ + fStack_59c * auVar106._4_4_;
        auVar88._0_8_ = CONCAT44(fVar212,fVar218);
        auVar88._8_4_ =
             fStack_638 * auVar148._8_4_ +
             fStack_628 * auVar117._8_4_ + fStack_4b8 * auVar138._8_4_ + fStack_598 * auVar106._8_4_
        ;
        auVar88._12_4_ =
             fStack_634 * auVar148._12_4_ +
             fStack_624 * auVar117._12_4_ +
             fStack_4b4 * auVar138._12_4_ + fStack_594 * auVar106._12_4_;
        auVar118._8_8_ = auVar88._0_8_;
        auVar118._0_8_ = auVar88._0_8_;
        auVar117 = vshufpd_avx(auVar88,auVar88,1);
        auVar148 = vmovshdup_avx(auVar269);
        auVar117 = vsubps_avx(auVar117,auVar118);
        auVar89._0_4_ = auVar148._0_4_ * auVar117._0_4_ + fVar218;
        auVar89._4_4_ = auVar148._4_4_ * auVar117._4_4_ + fVar212;
        auVar89._8_4_ = auVar148._8_4_ * auVar117._8_4_ + fVar218;
        auVar89._12_4_ = auVar148._12_4_ * auVar117._12_4_ + fVar212;
        auVar148 = vshufps_avx(auVar89,auVar89,0);
        auVar117 = vshufps_avx(auVar89,auVar89,0x55);
        auVar119._0_4_ = auVar150._0_4_ * auVar148._0_4_ + auVar223._0_4_ * auVar117._0_4_;
        auVar119._4_4_ = auVar150._4_4_ * auVar148._4_4_ + auVar223._4_4_ * auVar117._4_4_;
        auVar119._8_4_ = auVar150._8_4_ * auVar148._8_4_ + auVar223._8_4_ * auVar117._8_4_;
        auVar119._12_4_ = auVar150._12_4_ * auVar148._12_4_ + auVar223._12_4_ * auVar117._12_4_;
        auVar269 = vsubps_avx(auVar269,auVar119);
        auVar148 = vandps_avx(auVar261,auVar89);
        auVar117 = vshufps_avx(auVar148,auVar148,0xf5);
        auVar148 = vmaxss_avx(auVar117,auVar148);
        if (auVar148._0_4_ < (float)local_4d0._0_4_) {
          fVar218 = auVar269._0_4_;
          if ((0.0 <= fVar218) && (fVar218 <= 1.0)) {
            auVar150 = vmovshdup_avx(auVar269);
            fVar212 = auVar150._0_4_;
            if ((0.0 <= fVar212) && (fVar212 <= 1.0)) {
              auVar150 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                       ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar239 = vinsertps_avx(auVar150,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                       0x28);
              auVar150 = vdpps_avx(auVar239,local_3a0,0x7f);
              auVar223 = vdpps_avx(auVar239,local_3b0,0x7f);
              auVar148 = vdpps_avx(auVar239,local_3e0,0x7f);
              auVar117 = vdpps_avx(auVar239,local_3f0,0x7f);
              auVar106 = vdpps_avx(auVar239,local_400,0x7f);
              auVar138 = vdpps_avx(auVar239,local_410,0x7f);
              fVar237 = 1.0 - fVar212;
              auVar107 = vdpps_avx(auVar239,local_3c0,0x7f);
              auVar239 = vdpps_avx(auVar239,local_3d0,0x7f);
              fVar215 = 1.0 - fVar218;
              fVar235 = auVar269._4_4_;
              fVar213 = auVar269._8_4_;
              fVar236 = auVar269._12_4_;
              fVar214 = fVar215 * fVar218 * fVar218 * 3.0;
              auVar207._0_4_ = fVar218 * fVar218 * fVar218;
              auVar207._4_4_ = fVar235 * fVar235 * fVar235;
              auVar207._8_4_ = fVar213 * fVar213 * fVar213;
              auVar207._12_4_ = fVar236 * fVar236 * fVar236;
              fVar235 = fVar218 * 3.0 * fVar215 * fVar215;
              fVar213 = fVar215 * fVar215 * fVar215;
              fVar218 = (fVar237 * auVar150._0_4_ + fVar212 * auVar148._0_4_) * fVar213 +
                        (fVar237 * auVar223._0_4_ + fVar212 * auVar117._0_4_) * fVar235 +
                        fVar214 * (fVar237 * auVar107._0_4_ + fVar212 * auVar106._0_4_) +
                        auVar207._0_4_ * (auVar138._0_4_ * fVar212 + fVar237 * auVar239._0_4_);
              if ((fVar192 <= fVar218) &&
                 (fVar212 = *(float *)(ray + k * 4 + 0x100), fVar218 <= fVar212)) {
                pGVar11 = (context->scene->geometries).items[uVar65].ptr;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_0100f6eb:
                  bVar66 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar66 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_f0 = vshufps_avx(auVar269,auVar269,0x55);
                  auVar262._8_4_ = 0x3f800000;
                  auVar262._0_8_ = 0x3f8000003f800000;
                  auVar262._12_4_ = 0x3f800000;
                  auVar150 = vsubps_avx(auVar262,local_f0);
                  fVar236 = local_f0._0_4_;
                  fVar237 = local_f0._4_4_;
                  fVar238 = local_f0._8_4_;
                  fVar216 = local_f0._12_4_;
                  fVar240 = auVar150._0_4_;
                  fVar189 = auVar150._4_4_;
                  fVar190 = auVar150._8_4_;
                  fVar191 = auVar150._12_4_;
                  auVar276._0_4_ =
                       fVar236 * (float)local_4f0._0_4_ + fVar240 * (float)local_4e0._0_4_;
                  auVar276._4_4_ =
                       fVar237 * (float)local_4f0._4_4_ + fVar189 * (float)local_4e0._4_4_;
                  auVar276._8_4_ = fVar238 * fStack_4e8 + fVar190 * fStack_4d8;
                  auVar276._12_4_ = fVar216 * fStack_4e4 + fVar191 * fStack_4d4;
                  auVar289._0_4_ =
                       fVar236 * (float)local_540._0_4_ + fVar240 * (float)local_520._0_4_;
                  auVar289._4_4_ =
                       fVar237 * (float)local_540._4_4_ + fVar189 * (float)local_520._4_4_;
                  auVar289._8_4_ = fVar238 * fStack_538 + fVar190 * fStack_518;
                  auVar289._12_4_ = fVar216 * fStack_534 + fVar191 * fStack_514;
                  auVar299._0_4_ =
                       fVar236 * (float)local_430._0_4_ + fVar240 * (float)local_530._0_4_;
                  auVar299._4_4_ =
                       fVar237 * (float)local_430._4_4_ + fVar189 * (float)local_530._4_4_;
                  auVar299._8_4_ = fVar238 * fStack_428 + fVar190 * fStack_528;
                  auVar299._12_4_ = fVar216 * fStack_424 + fVar191 * fStack_524;
                  auVar263._0_4_ =
                       fVar236 * (float)local_510._0_4_ + fVar240 * (float)local_500._0_4_;
                  auVar263._4_4_ =
                       fVar237 * (float)local_510._4_4_ + fVar189 * (float)local_500._4_4_;
                  auVar263._8_4_ = fVar238 * fStack_508 + fVar190 * fStack_4f8;
                  auVar263._12_4_ = fVar216 * fStack_504 + fVar191 * fStack_4f4;
                  auVar117 = vsubps_avx(auVar289,auVar276);
                  auVar106 = vsubps_avx(auVar299,auVar289);
                  auVar138 = vsubps_avx(auVar263,auVar299);
                  local_110 = vshufps_avx(auVar269,auVar269,0);
                  fVar236 = local_110._0_4_;
                  fVar238 = local_110._4_4_;
                  fVar216 = local_110._8_4_;
                  fVar189 = local_110._12_4_;
                  auVar150 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
                  fVar237 = auVar150._0_4_;
                  fVar215 = auVar150._4_4_;
                  fVar240 = auVar150._8_4_;
                  fVar190 = auVar150._12_4_;
                  auVar150 = vshufps_avx(auVar207,auVar207,0);
                  auVar223 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
                  auVar148 = vshufps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),0);
                  auVar182._0_4_ =
                       ((auVar106._0_4_ * fVar237 + auVar138._0_4_ * fVar236) * fVar236 +
                       (auVar117._0_4_ * fVar237 + auVar106._0_4_ * fVar236) * fVar237) * 3.0;
                  auVar182._4_4_ =
                       ((auVar106._4_4_ * fVar215 + auVar138._4_4_ * fVar238) * fVar238 +
                       (auVar117._4_4_ * fVar215 + auVar106._4_4_ * fVar238) * fVar215) * 3.0;
                  auVar182._8_4_ =
                       ((auVar106._8_4_ * fVar240 + auVar138._8_4_ * fVar216) * fVar216 +
                       (auVar117._8_4_ * fVar240 + auVar106._8_4_ * fVar216) * fVar240) * 3.0;
                  auVar182._12_4_ =
                       ((auVar106._12_4_ * fVar190 + auVar138._12_4_ * fVar189) * fVar189 +
                       (auVar117._12_4_ * fVar190 + auVar106._12_4_ * fVar189) * fVar190) * 3.0;
                  auVar117 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
                  auVar120._0_4_ =
                       auVar117._0_4_ * (float)local_440._0_4_ +
                       auVar148._0_4_ * (float)local_450._0_4_ +
                       auVar150._0_4_ * (float)local_470._0_4_ +
                       auVar223._0_4_ * (float)local_460._0_4_;
                  auVar120._4_4_ =
                       auVar117._4_4_ * (float)local_440._4_4_ +
                       auVar148._4_4_ * (float)local_450._4_4_ +
                       auVar150._4_4_ * (float)local_470._4_4_ +
                       auVar223._4_4_ * (float)local_460._4_4_;
                  auVar120._8_4_ =
                       auVar117._8_4_ * fStack_438 +
                       auVar148._8_4_ * fStack_448 +
                       auVar150._8_4_ * fStack_468 + auVar223._8_4_ * fStack_458;
                  auVar120._12_4_ =
                       auVar117._12_4_ * fStack_434 +
                       auVar148._12_4_ * fStack_444 +
                       auVar150._12_4_ * fStack_464 + auVar223._12_4_ * fStack_454;
                  auVar150 = vshufps_avx(auVar182,auVar182,0xc9);
                  auVar149._0_4_ = auVar120._0_4_ * auVar150._0_4_;
                  auVar149._4_4_ = auVar120._4_4_ * auVar150._4_4_;
                  auVar149._8_4_ = auVar120._8_4_ * auVar150._8_4_;
                  auVar149._12_4_ = auVar120._12_4_ * auVar150._12_4_;
                  auVar150 = vshufps_avx(auVar120,auVar120,0xc9);
                  auVar121._0_4_ = auVar182._0_4_ * auVar150._0_4_;
                  auVar121._4_4_ = auVar182._4_4_ * auVar150._4_4_;
                  auVar121._8_4_ = auVar182._8_4_ * auVar150._8_4_;
                  auVar121._12_4_ = auVar182._12_4_ * auVar150._12_4_;
                  auVar150 = vsubps_avx(auVar121,auVar149);
                  local_170 = vshufps_avx(auVar150,auVar150,0x55);
                  local_180[0] = (RTCHitN)local_170[0];
                  local_180[1] = (RTCHitN)local_170[1];
                  local_180[2] = (RTCHitN)local_170[2];
                  local_180[3] = (RTCHitN)local_170[3];
                  local_180[4] = (RTCHitN)local_170[4];
                  local_180[5] = (RTCHitN)local_170[5];
                  local_180[6] = (RTCHitN)local_170[6];
                  local_180[7] = (RTCHitN)local_170[7];
                  local_180[8] = (RTCHitN)local_170[8];
                  local_180[9] = (RTCHitN)local_170[9];
                  local_180[10] = (RTCHitN)local_170[10];
                  local_180[0xb] = (RTCHitN)local_170[0xb];
                  local_180[0xc] = (RTCHitN)local_170[0xc];
                  local_180[0xd] = (RTCHitN)local_170[0xd];
                  local_180[0xe] = (RTCHitN)local_170[0xe];
                  local_180[0xf] = (RTCHitN)local_170[0xf];
                  local_150 = vshufps_avx(auVar150,auVar150,0xaa);
                  local_160 = local_150;
                  local_130 = vshufps_avx(auVar150,auVar150,0);
                  local_140 = local_130;
                  local_120 = local_110;
                  local_100 = local_f0;
                  local_e0 = local_320._0_8_;
                  uStack_d8 = local_320._8_8_;
                  uStack_d0 = local_320._16_8_;
                  uStack_c8 = local_320._24_8_;
                  local_c0 = local_300._0_8_;
                  uStack_b8 = local_300._8_8_;
                  uStack_b0 = local_300._16_8_;
                  uStack_a8 = local_300._24_8_;
                  auVar90 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar218;
                  local_580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar69 & 0xf) << 4));
                  local_570 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)((int)uVar69 >> 4) * 0x10);
                  local_4a0.valid = (int *)local_580;
                  local_4a0.geometryUserPtr = pGVar11->userPtr;
                  local_4a0.context = context->user;
                  local_4a0.ray = (RTCRayN *)ray;
                  local_4a0.hit = local_180;
                  local_4a0.N = 8;
                  if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar11->occlusionFilterN)(&local_4a0);
                  }
                  auVar150 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
                  auVar223 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
                  auVar156._16_16_ = auVar223;
                  auVar156._0_16_ = auVar150;
                  auVar17 = auVar90 & ~auVar156;
                  if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar17 >> 0x7f,0) != '\0') ||
                        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar17 >> 0xbf,0) != '\0') ||
                      (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar17[0x1f] < '\0') {
                    p_Var12 = context->args->filter;
                    if (p_Var12 == (RTCFilterFunctionN)0x0) {
                      auVar150 = SUB6416(ZEXT864(0),0) << 0x20;
                    }
                    else {
                      auVar150 = SUB6416(ZEXT864(0),0) << 0x20;
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var12)(&local_4a0);
                        auVar150 = ZEXT816(0) << 0x40;
                      }
                    }
                    auVar223 = vpcmpeqd_avx(local_580,auVar150);
                    auVar150 = vpcmpeqd_avx(local_570,auVar150);
                    auVar99._16_16_ = auVar150;
                    auVar99._0_16_ = auVar223;
                    auVar130._8_4_ = 0xff800000;
                    auVar130._0_8_ = 0xff800000ff800000;
                    auVar130._12_4_ = 0xff800000;
                    auVar130._16_4_ = 0xff800000;
                    auVar130._20_4_ = 0xff800000;
                    auVar130._24_4_ = 0xff800000;
                    auVar130._28_4_ = 0xff800000;
                    auVar17 = vblendvps_avx(auVar130,*(undefined1 (*) [32])(local_4a0.ray + 0x100),
                                            auVar99);
                    *(undefined1 (*) [32])(local_4a0.ray + 0x100) = auVar17;
                    auVar90 = auVar90 & ~auVar99;
                    if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar90 >> 0x7f,0) != '\0') ||
                          (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar90 >> 0xbf,0) != '\0') ||
                        (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar90[0x1f] < '\0') {
                      bVar66 = 1;
                      goto LAB_0100f6ed;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar212;
                  goto LAB_0100f6eb;
                }
LAB_0100f6ed:
                bVar74 = (bool)(bVar74 | bVar66);
              }
            }
          }
          break;
        }
        lVar71 = lVar71 + -1;
      } while (lVar71 != 0);
      goto LAB_0100e627;
    }
    auVar150 = vinsertps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar218),0x10);
    auVar322 = ZEXT1664(auVar150);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }